

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__decode_samples_with_residual__rice__scalar
                    (ma_dr_flac_bs *bs,ma_uint32 bitsPerSample,ma_uint32 count,ma_uint8 riceParam,
                    ma_uint32 lpcOrder,ma_int32 lpcShift,ma_uint32 lpcPrecision,
                    ma_int32 *coefficients,ma_int32 *pSamplesOut)

{
  int *piVar1;
  ushort uVar2;
  ulong uVar3;
  uint uVar4;
  ma_bool32 mVar5;
  int iVar6;
  ulong uVar7;
  ma_dr_flac_cache_t mVar8;
  ulong uVar9;
  byte bVar10;
  ma_uint32 mVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ushort uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  uint uVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  uint uVar50;
  int iVar51;
  bool bVar52;
  uint local_110;
  uint local_108;
  uint local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  uint local_a0;
  int local_5c;
  byte bVar11;
  byte bVar12;
  
  uVar42 = (uint)riceParam;
  if (lpcOrder == 0) {
    uVar42 = 0x3f - uVar42;
    for (uVar9 = 0; uVar9 != count; uVar9 = uVar9 + 1) {
      uVar7 = bs->cache;
      mVar13 = bs->consumedBits;
      if (ma_dr_flac__gIsLZCNTSupported == 0) {
        if (uVar7 != 0) {
          if (uVar7 < 0x1000000000000000) {
            bVar52 = uVar7 >> 0x20 == 0;
            uVar23 = uVar7 << 0x20;
            if (!bVar52) {
              uVar23 = uVar7;
            }
            iVar30 = (uint)bVar52 * 0x20;
            iVar45 = iVar30 + 0x10;
            uVar3 = uVar23 << 0x10;
            if (0xffffffffffff < uVar23) {
              iVar45 = iVar30;
              uVar3 = uVar23;
            }
            iVar30 = iVar45 + 8;
            uVar23 = uVar3 << 8;
            if (0xffffffffffffff < uVar3) {
              iVar30 = iVar45;
              uVar23 = uVar3;
            }
            iVar45 = iVar30 + 4;
            uVar3 = uVar23 << 4;
            if (0xfffffffffffffff < uVar23) {
              iVar45 = iVar30;
              uVar3 = uVar23;
            }
            iVar45 = iVar45 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar3 >> 0x3c) * 4);
          }
          else {
            iVar45 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                             (uVar7 >> 0x3c) * 4);
          }
          uVar4 = iVar45 - 1;
          goto LAB_00182e27;
        }
LAB_00182e35:
        uVar24 = 0x40 - mVar13;
        do {
          uVar4 = bs->nextL2Line;
          if ((ulong)uVar4 < 0x200) {
            uVar19 = bs->crc16;
            uVar27 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar34 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar49 = (uint)(mVar8 >> 0x10);
              uVar25 = (uint)(mVar8 >> 0x18);
              uVar50 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar50 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar50 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar25 & 0xff] <<
                              8 ^ uVar34 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar50 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar50 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar25 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar50 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar50 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar50 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar25 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar50 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff] << 8 ^ uVar34 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar50 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar50 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar34) & 0xff]
                ;
                break;
              case 1:
                uVar27 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar50 ^ uVar27) >> 8 & 0xff]);
              case 3:
                uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar50 ^ uVar27 >> 8) & 0xff]);
              case 4:
                uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                       ma_dr_flac__crc16_table[uVar27 >> 8 ^ uVar25 & 0xff]);
              case 5:
                uVar27 = (uint)(ushort)((ushort)(uVar27 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar27 >> 8 ^ uVar49 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar27 << 8) ^
                         ma_dr_flac__crc16_table[(uVar34 ^ uVar27) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar34 ^ uVar19 >> 8) & 0xff];
                goto LAB_00183004;
              }
            }
            else {
LAB_00183004:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar4 + 1;
            uVar7 = bs->cacheL2[uVar4];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            mVar13 = 0;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            uVar7 = bs->cache;
            mVar13 = bs->consumedBits;
          }
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            uVar4 = 0x40;
            if (uVar7 != 0) {
              if (uVar7 < 0x1000000000000000) {
                bVar52 = uVar7 >> 0x20 == 0;
                uVar23 = uVar7 << 0x20;
                if (!bVar52) {
                  uVar23 = uVar7;
                }
                iVar30 = (uint)bVar52 * 0x20;
                iVar45 = iVar30 + 0x10;
                uVar3 = uVar23 << 0x10;
                if (0xffffffffffff < uVar23) {
                  iVar45 = iVar30;
                  uVar3 = uVar23;
                }
                iVar30 = iVar45 + 8;
                uVar23 = uVar3 << 8;
                if (0xffffffffffffff < uVar3) {
                  iVar30 = iVar45;
                  uVar23 = uVar3;
                }
                iVar45 = iVar30 + 4;
                uVar3 = uVar23 << 4;
                if (0xfffffffffffffff < uVar23) {
                  iVar45 = iVar30;
                  uVar3 = uVar23;
                }
                iVar45 = iVar45 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar3 >> 0x3c) * 4);
              }
              else {
                iVar45 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar7 >> 0x3c) * 4);
              }
              uVar4 = iVar45 - 1;
            }
          }
          else {
            uVar4 = (uint)LZCOUNT(uVar7);
          }
          uVar24 = uVar24 + uVar4;
        } while (0x3f < uVar4);
      }
      else {
        uVar4 = (uint)LZCOUNT(uVar7);
LAB_00182e27:
        uVar24 = uVar4;
        if (0x3f < uVar4) goto LAB_00182e35;
      }
      uVar7 = uVar7 << ((byte)uVar4 & 0x3f);
      uVar4 = mVar13 + uVar4;
      uVar27 = (uint)(uVar7 >> ((byte)uVar42 & 0x3f));
      if (uVar42 < uVar4) {
        uVar4 = uVar4 - uVar42;
        uVar25 = bs->nextL2Line;
        if ((ulong)uVar25 < 0x200) {
          uVar19 = bs->crc16;
          uVar49 = (uint)uVar19;
          if (bs->crc16CacheIgnoredBytes < 8) {
            mVar8 = bs->crc16Cache;
            uVar46 = (uint)mVar8;
            uVar2 = (ushort)(mVar8 >> 0x30);
            uVar34 = (uint)(mVar8 >> 0x10);
            uVar50 = (uint)(mVar8 >> 0x18);
            uVar20 = (uint)(mVar8 >> 0x20);
            switch(bs->crc16CacheIgnoredBytes) {
            case 0:
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar20 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)uVar2 ^
                                                  ((uint)uVar19 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar19 >> 8) ^
                                                         (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)uVar2 ^
                                                            ((uint)uVar19 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar19 >> 8) ^
                                                                   (uint)(byte)(mVar8 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar20 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar19 >> 8) ^
                                                                   (uint)(byte)(mVar8 >> 0x38)] << 8
                                                           ^ (uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar19 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar19 >> 8) ^
                                                                           (uint)(byte)(mVar8 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                                  ) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   uVar50 & 0xff] << 8 ^ uVar46 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar20 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [((uint)ma_dr_flac__crc16_table
                                                 [(uVar20 >> 8 ^
                                                  ((uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar2 ^
                                                         ((uint)uVar19 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                          (uint)ma_dr_flac__crc16_table
                                                [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar20 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar50 & 0xff])
                                   >> 8 & 0xff ^ uVar34 & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar20 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar20 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) & 0xff]
                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [((uint)ma_dr_flac__crc16_table
                                                          [(uVar20 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar19 >> 8) ^
                                                                   (uint)(byte)(mVar8 >> 0x38)] << 8
                                                           ^ (uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar19 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar19 >> 8) ^
                                                                           (uint)(byte)(mVar8 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                                  << 8 ^ (uint)ma_dr_flac__crc16_table
                                                               [(uVar20 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar50 & 0xff] << 8 ^ uVar46 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [(((uint)ma_dr_flac__crc16_table
                                                          [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar20 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar46) & 0xff]
              ;
              goto LAB_0018331e;
            case 1:
              uVar49 = (uint)(ushort)(uVar19 << 8 ^
                                     ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
            case 2:
              uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                     ma_dr_flac__crc16_table[(uVar20 ^ uVar49) >> 8 & 0xff]);
            case 3:
              uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                     ma_dr_flac__crc16_table[(uVar20 ^ uVar49 >> 8) & 0xff]);
            case 4:
              uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                     ma_dr_flac__crc16_table[uVar49 >> 8 ^ uVar50 & 0xff]);
            case 5:
              uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                     ma_dr_flac__crc16_table[(uVar49 >> 8 ^ uVar34 & 0xffff) & 0xff]
                                     );
              break;
            case 6:
              break;
            case 7:
              goto switchD_0018314c_caseD_7;
            }
            uVar19 = (ushort)(uVar49 << 8) ^ ma_dr_flac__crc16_table[(uVar46 ^ uVar49) >> 8 & 0xff];
switchD_0018314c_caseD_7:
            uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar46 ^ uVar19 >> 8) & 0xff];
          }
          bs->crc16 = uVar19;
          bs->crc16CacheIgnoredBytes = 0;
LAB_0018331e:
          bs->nextL2Line = uVar25 + 1;
          uVar7 = bs->cacheL2[uVar25];
          uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38;
          bs->crc16Cache = uVar7;
          uVar25 = uVar4;
        }
        else {
          mVar5 = ma_dr_flac__reload_cache(bs);
          if (mVar5 == 0) {
            return 0;
          }
          if (0x40 - (ulong)bs->consumedBits < (ulong)uVar4) {
            return 0;
          }
          uVar7 = bs->cache;
          uVar25 = bs->consumedBits + uVar4;
        }
        uVar27 = uVar27 | (uint)(uVar7 >> (-(byte)uVar4 & 0x3f));
        mVar8 = uVar7 << ((byte)uVar4 & 0x3f);
      }
      else {
        mVar8 = uVar7 << ((byte)(riceParam + 1) & 0x3f);
        uVar25 = uVar4 + riceParam + 1;
      }
      bs->cache = mVar8;
      bs->consumedBits = uVar25;
      uVar4 = uVar24 << (riceParam & 0x1f) | uVar27 & ~(uint)(-1L << (riceParam & 0x3f));
      pSamplesOut[uVar9] = uVar4 >> 1 ^ *(uint *)(&DAT_0018fa00 + (ulong)(uVar4 & 1) * 4);
    }
  }
  else {
    uVar9 = (ulong)(count & 0xfffffffc);
    piVar1 = pSamplesOut + uVar9;
    uVar4 = lpcPrecision + bitsPerSample;
    for (mVar13 = lpcOrder; mVar13 != 0; mVar13 = mVar13 >> 1) {
      uVar4 = uVar4 + 1;
    }
    uVar27 = ~(uint)(-1L << (riceParam & 0x3f));
    uVar24 = 0x3f - uVar42;
    iVar45 = uVar42 + 1;
    bVar10 = (byte)iVar45;
    bVar11 = (byte)lpcShift;
    bVar12 = (byte)uVar24;
    if (uVar4 < 0x21) {
      while (pSamplesOut < piVar1) {
        uVar7 = bs->cache;
        mVar13 = bs->consumedBits;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar7 != 0) {
            if (uVar7 < 0x1000000000000000) {
              bVar52 = uVar7 >> 0x20 == 0;
              uVar23 = uVar7 << 0x20;
              if (!bVar52) {
                uVar23 = uVar7;
              }
              iVar39 = (uint)bVar52 * 0x20;
              iVar30 = iVar39 + 0x10;
              uVar3 = uVar23 << 0x10;
              if (0xffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar39 = iVar30 + 8;
              uVar23 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar39 = iVar30;
                uVar23 = uVar3;
              }
              iVar30 = iVar39 + 4;
              uVar3 = uVar23 << 4;
              if (0xfffffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar7 >> 0x3c) * 4);
            }
            uVar42 = iVar30 - 1;
            goto LAB_0017e779;
          }
LAB_0017e788:
          local_108 = 0x40 - mVar13;
          do {
            uVar42 = bs->nextL2Line;
            if ((ulong)uVar42 < 0x200) {
              uVar19 = bs->crc16;
              uVar4 = (uint)uVar19;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar8 = bs->crc16Cache;
                uVar34 = (uint)mVar8;
                uVar2 = (ushort)(mVar8 >> 0x30);
                uVar49 = (uint)(mVar8 >> 0x10);
                uVar25 = (uint)(mVar8 >> 0x18);
                uVar50 = (uint)(mVar8 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar50 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar19 >> 8) ^
                                                       (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar19 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar19 >> 8) ^
                                                             (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar50 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar19 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar25 & 0xff] <<
                                8 ^ uVar34 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar50 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar50 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar50 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar25 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar50 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar50 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar25 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar50 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar19 >> 8) ^
                                                               (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar25 & 0xff] << 8 ^ uVar34 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar50 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar34) & 0xff];
                  break;
                case 1:
                  uVar4 = (uint)(ushort)(uVar19 << 8 ^
                                        ma_dr_flac__crc16_table
                                        [(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
                case 2:
                  uVar4 = (uint)(ushort)((ushort)(uVar4 << 8) ^
                                        ma_dr_flac__crc16_table[(uVar50 ^ uVar4) >> 8 & 0xff]);
                case 3:
                  uVar4 = (uint)(ushort)((ushort)(uVar4 << 8) ^
                                        ma_dr_flac__crc16_table[(uVar50 ^ uVar4 >> 8) & 0xff]);
                case 4:
                  uVar4 = (uint)(ushort)((ushort)(uVar4 << 8) ^
                                        ma_dr_flac__crc16_table[uVar4 >> 8 ^ uVar25 & 0xff]);
                case 5:
                  uVar4 = (uint)(ushort)((ushort)(uVar4 << 8) ^
                                        ma_dr_flac__crc16_table
                                        [(uVar4 >> 8 ^ uVar49 & 0xffff) & 0xff]);
                case 6:
                  uVar19 = (ushort)(uVar4 << 8) ^
                           ma_dr_flac__crc16_table[(uVar34 ^ uVar4) >> 8 & 0xff];
                case 7:
                  uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar34 ^ uVar19 >> 8) & 0xff];
                  goto LAB_0017e97a;
                }
              }
              else {
LAB_0017e97a:
                bs->crc16 = uVar19;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar42 + 1;
              uVar7 = bs->cacheL2[uVar42];
              uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
              bs->crc16Cache = uVar7;
              mVar13 = 0;
            }
            else {
              mVar5 = ma_dr_flac__reload_cache(bs);
              if (mVar5 == 0) {
                return 0;
              }
              uVar7 = bs->cache;
              mVar13 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              uVar42 = 0x40;
              if (uVar7 != 0) {
                if (uVar7 < 0x1000000000000000) {
                  bVar52 = uVar7 >> 0x20 == 0;
                  uVar23 = uVar7 << 0x20;
                  if (!bVar52) {
                    uVar23 = uVar7;
                  }
                  iVar39 = (uint)bVar52 * 0x20;
                  iVar30 = iVar39 + 0x10;
                  uVar3 = uVar23 << 0x10;
                  if (0xffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar39 = iVar30 + 8;
                  uVar23 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar39 = iVar30;
                    uVar23 = uVar3;
                  }
                  iVar30 = iVar39 + 4;
                  uVar3 = uVar23 << 4;
                  if (0xfffffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar7 >> 0x3c) * 4);
                }
                uVar42 = iVar30 - 1;
              }
            }
            else {
              uVar42 = (uint)LZCOUNT(uVar7);
            }
            local_108 = local_108 + uVar42;
          } while (0x3f < uVar42);
        }
        else {
          uVar42 = (uint)LZCOUNT(uVar7);
LAB_0017e779:
          local_108 = uVar42;
          if (0x3f < uVar42) goto LAB_0017e788;
        }
        uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar13 + uVar42;
        local_e8 = (uint)(uVar7 >> (bVar12 & 0x3f));
        if (uVar24 < uVar42) {
          uVar42 = uVar42 - uVar24;
          uVar4 = bs->nextL2Line;
          if ((ulong)uVar4 < 0x200) {
            uVar19 = bs->crc16;
            uVar25 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar20 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar50 = (uint)(mVar8 >> 0x10);
              uVar49 = (uint)(mVar8 >> 0x18);
              uVar34 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar34 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar34 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar49 & 0xff] <<
                              8 ^ uVar20 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar34 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar34 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar34 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar34 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar34 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar34 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar49 & 0xff] << 8 ^ uVar20 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar34 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar34 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar20) & 0xff]
                ;
                break;
              case 1:
                uVar25 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar34 ^ uVar25) >> 8 & 0xff]);
              case 3:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar34 ^ uVar25 >> 8) & 0xff]);
              case 4:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[uVar25 >> 8 ^ uVar49 & 0xff]);
              case 5:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar25 >> 8 ^ uVar50 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar25 << 8) ^
                         ma_dr_flac__crc16_table[(uVar20 ^ uVar25) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar20 ^ uVar19 >> 8) & 0xff];
                goto LAB_0017eccb;
              }
            }
            else {
LAB_0017eccb:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar4 + 1;
            uVar7 = bs->cacheL2[uVar4];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            mVar13 = uVar42;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar42) {
              return 0;
            }
            uVar7 = bs->cache;
            mVar13 = bs->consumedBits + uVar42;
          }
          local_e8 = local_e8 | (uint)(uVar7 >> (-(byte)uVar42 & 0x3f));
          uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        }
        else {
          uVar7 = uVar7 << (bVar10 & 0x3f);
          mVar13 = uVar42 + iVar45;
        }
        bs->cache = uVar7;
        bs->consumedBits = mVar13;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar7 != 0) {
            if (uVar7 < 0x1000000000000000) {
              bVar52 = uVar7 >> 0x20 == 0;
              uVar23 = uVar7 << 0x20;
              if (!bVar52) {
                uVar23 = uVar7;
              }
              iVar39 = (uint)bVar52 * 0x20;
              iVar30 = iVar39 + 0x10;
              uVar3 = uVar23 << 0x10;
              if (0xffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar39 = iVar30 + 8;
              uVar23 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar39 = iVar30;
                uVar23 = uVar3;
              }
              iVar30 = iVar39 + 4;
              uVar3 = uVar23 << 4;
              if (0xfffffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar7 >> 0x3c) * 4);
            }
            uVar42 = iVar30 - 1;
            goto LAB_0017edc6;
          }
LAB_0017edd4:
          uVar4 = 0x40 - mVar13;
          do {
            uVar42 = bs->nextL2Line;
            if ((ulong)uVar42 < 0x200) {
              uVar19 = bs->crc16;
              uVar25 = (uint)uVar19;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar8 = bs->crc16Cache;
                uVar20 = (uint)mVar8;
                uVar2 = (ushort)(mVar8 >> 0x30);
                uVar50 = (uint)(mVar8 >> 0x10);
                uVar49 = (uint)(mVar8 >> 0x18);
                uVar34 = (uint)(mVar8 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar34 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar19 >> 8) ^
                                                       (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar19 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar19 >> 8) ^
                                                             (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar34 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar19 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar49 & 0xff] <<
                                8 ^ uVar20 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar34 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar34 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar34 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar34 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar34 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar34 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar19 >> 8) ^
                                                               (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar49 & 0xff] << 8 ^ uVar20 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar34 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar20) & 0xff];
                  break;
                case 1:
                  uVar25 = (uint)(ushort)(uVar19 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
                case 2:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar34 ^ uVar25) >> 8 & 0xff]);
                case 3:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar34 ^ uVar25 >> 8) & 0xff]);
                case 4:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table[uVar25 >> 8 ^ uVar49 & 0xff]);
                case 5:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar25 >> 8 ^ uVar50 & 0xffff) & 0xff]);
                case 6:
                  uVar19 = (ushort)(uVar25 << 8) ^
                           ma_dr_flac__crc16_table[(uVar20 ^ uVar25) >> 8 & 0xff];
                case 7:
                  uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar20 ^ uVar19 >> 8) & 0xff];
                  goto LAB_0017efc4;
                }
              }
              else {
LAB_0017efc4:
                bs->crc16 = uVar19;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar42 + 1;
              uVar7 = bs->cacheL2[uVar42];
              uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
              bs->crc16Cache = uVar7;
              mVar13 = 0;
            }
            else {
              mVar5 = ma_dr_flac__reload_cache(bs);
              if (mVar5 == 0) {
                return 0;
              }
              uVar7 = bs->cache;
              mVar13 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              uVar42 = 0x40;
              if (uVar7 != 0) {
                if (uVar7 < 0x1000000000000000) {
                  bVar52 = uVar7 >> 0x20 == 0;
                  uVar23 = uVar7 << 0x20;
                  if (!bVar52) {
                    uVar23 = uVar7;
                  }
                  iVar39 = (uint)bVar52 * 0x20;
                  iVar30 = iVar39 + 0x10;
                  uVar3 = uVar23 << 0x10;
                  if (0xffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar39 = iVar30 + 8;
                  uVar23 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar39 = iVar30;
                    uVar23 = uVar3;
                  }
                  iVar30 = iVar39 + 4;
                  uVar3 = uVar23 << 4;
                  if (0xfffffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar7 >> 0x3c) * 4);
                }
                uVar42 = iVar30 - 1;
              }
            }
            else {
              uVar42 = (uint)LZCOUNT(uVar7);
            }
            uVar4 = uVar4 + uVar42;
          } while (0x3f < uVar42);
        }
        else {
          uVar42 = (uint)LZCOUNT(uVar7);
LAB_0017edc6:
          uVar4 = uVar42;
          if (0x3f < uVar42) goto LAB_0017edd4;
        }
        uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar13 + uVar42;
        local_110 = (uint)(uVar7 >> (bVar12 & 0x3f));
        if (uVar24 < uVar42) {
          uVar42 = uVar42 - uVar24;
          uVar25 = bs->nextL2Line;
          if ((ulong)uVar25 < 0x200) {
            uVar19 = bs->crc16;
            uVar49 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar46 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar34 = (uint)(mVar8 >> 0x10);
              uVar50 = (uint)(mVar8 >> 0x18);
              uVar20 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar20 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar20 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar50 & 0xff] <<
                              8 ^ uVar46 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar20 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar20 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar20 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar20 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar20 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar20 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar50 & 0xff] << 8 ^ uVar46 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar20 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar20 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar46) & 0xff]
                ;
                break;
              case 1:
                uVar49 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar20 ^ uVar49) >> 8 & 0xff]);
              case 3:
                uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar20 ^ uVar49 >> 8) & 0xff]);
              case 4:
                uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                       ma_dr_flac__crc16_table[uVar49 >> 8 ^ uVar50 & 0xff]);
              case 5:
                uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar49 >> 8 ^ uVar34 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar49 << 8) ^
                         ma_dr_flac__crc16_table[(uVar46 ^ uVar49) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar46 ^ uVar19 >> 8) & 0xff];
                goto LAB_0017f300;
              }
            }
            else {
LAB_0017f300:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar25 + 1;
            uVar7 = bs->cacheL2[uVar25];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            mVar13 = uVar42;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar42) {
              return 0;
            }
            uVar7 = bs->cache;
            mVar13 = bs->consumedBits + uVar42;
          }
          local_110 = local_110 | (uint)(uVar7 >> (-(byte)uVar42 & 0x3f));
          uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        }
        else {
          uVar7 = uVar7 << (bVar10 & 0x3f);
          mVar13 = uVar42 + iVar45;
        }
        bs->cache = uVar7;
        bs->consumedBits = mVar13;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar7 != 0) {
            if (uVar7 < 0x1000000000000000) {
              bVar52 = uVar7 >> 0x20 == 0;
              uVar23 = uVar7 << 0x20;
              if (!bVar52) {
                uVar23 = uVar7;
              }
              iVar39 = (uint)bVar52 * 0x20;
              iVar30 = iVar39 + 0x10;
              uVar3 = uVar23 << 0x10;
              if (0xffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar39 = iVar30 + 8;
              uVar23 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar39 = iVar30;
                uVar23 = uVar3;
              }
              iVar30 = iVar39 + 4;
              uVar3 = uVar23 << 4;
              if (0xfffffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar7 >> 0x3c) * 4);
            }
            uVar42 = iVar30 - 1;
            goto LAB_0017f3f7;
          }
LAB_0017f403:
          uVar25 = 0x40 - mVar13;
          do {
            uVar42 = bs->nextL2Line;
            if ((ulong)uVar42 < 0x200) {
              uVar19 = bs->crc16;
              uVar49 = (uint)uVar19;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar8 = bs->crc16Cache;
                uVar46 = (uint)mVar8;
                uVar2 = (ushort)(mVar8 >> 0x30);
                uVar34 = (uint)(mVar8 >> 0x10);
                uVar50 = (uint)(mVar8 >> 0x18);
                uVar20 = (uint)(mVar8 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar20 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar19 >> 8) ^
                                                       (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar19 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar19 >> 8) ^
                                                             (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar20 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar19 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar50 & 0xff] <<
                                8 ^ uVar46 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar20 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar20 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar20 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar20 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar20 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar20 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar19 >> 8) ^
                                                               (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar50 & 0xff] << 8 ^ uVar46 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar20 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar46) & 0xff];
                  break;
                case 1:
                  uVar49 = (uint)(ushort)(uVar19 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
                case 2:
                  uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar20 ^ uVar49) >> 8 & 0xff]);
                case 3:
                  uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar20 ^ uVar49 >> 8) & 0xff]);
                case 4:
                  uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                         ma_dr_flac__crc16_table[uVar49 >> 8 ^ uVar50 & 0xff]);
                case 5:
                  uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar49 >> 8 ^ uVar34 & 0xffff) & 0xff]);
                case 6:
                  uVar19 = (ushort)(uVar49 << 8) ^
                           ma_dr_flac__crc16_table[(uVar46 ^ uVar49) >> 8 & 0xff];
                case 7:
                  uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar46 ^ uVar19 >> 8) & 0xff];
                  goto LAB_0017f5f2;
                }
              }
              else {
LAB_0017f5f2:
                bs->crc16 = uVar19;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar42 + 1;
              uVar7 = bs->cacheL2[uVar42];
              uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
              bs->crc16Cache = uVar7;
              mVar13 = 0;
            }
            else {
              mVar5 = ma_dr_flac__reload_cache(bs);
              if (mVar5 == 0) {
                return 0;
              }
              uVar7 = bs->cache;
              mVar13 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              uVar42 = 0x40;
              if (uVar7 != 0) {
                if (uVar7 < 0x1000000000000000) {
                  bVar52 = uVar7 >> 0x20 == 0;
                  uVar23 = uVar7 << 0x20;
                  if (!bVar52) {
                    uVar23 = uVar7;
                  }
                  iVar39 = (uint)bVar52 * 0x20;
                  iVar30 = iVar39 + 0x10;
                  uVar3 = uVar23 << 0x10;
                  if (0xffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar39 = iVar30 + 8;
                  uVar23 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar39 = iVar30;
                    uVar23 = uVar3;
                  }
                  iVar30 = iVar39 + 4;
                  uVar3 = uVar23 << 4;
                  if (0xfffffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar7 >> 0x3c) * 4);
                }
                uVar42 = iVar30 - 1;
              }
            }
            else {
              uVar42 = (uint)LZCOUNT(uVar7);
            }
            uVar25 = uVar25 + uVar42;
          } while (0x3f < uVar42);
        }
        else {
          uVar42 = (uint)LZCOUNT(uVar7);
LAB_0017f3f7:
          uVar25 = uVar42;
          if (0x3f < uVar42) goto LAB_0017f403;
        }
        uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar13 + uVar42;
        uVar49 = (uint)(uVar7 >> (bVar12 & 0x3f));
        if (uVar24 < uVar42) {
          uVar42 = uVar42 - uVar24;
          uVar50 = bs->nextL2Line;
          if ((ulong)uVar50 < 0x200) {
            uVar19 = bs->crc16;
            uVar34 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar14 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar46 = (uint)(mVar8 >> 0x10);
              uVar20 = (uint)(mVar8 >> 0x18);
              uVar17 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar17 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar17 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar20 & 0xff] <<
                              8 ^ uVar14 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar17 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar17 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar20 & 0xff]) >> 8 & 0xff ^ uVar46 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar17 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar17 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar17 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar20 & 0xff]) >> 8 & 0xff ^ uVar46 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar17 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar20 & 0xff] << 8 ^ uVar14 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar17 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar17 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar20 & 0xff]) >> 8 & 0xff ^ uVar46 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar14) & 0xff]
                ;
                break;
              case 1:
                uVar34 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar34 = (uint)(ushort)((ushort)(uVar34 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar17 ^ uVar34) >> 8 & 0xff]);
              case 3:
                uVar34 = (uint)(ushort)((ushort)(uVar34 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar17 ^ uVar34 >> 8) & 0xff]);
              case 4:
                uVar34 = (uint)(ushort)((ushort)(uVar34 << 8) ^
                                       ma_dr_flac__crc16_table[uVar34 >> 8 ^ uVar20 & 0xff]);
              case 5:
                uVar34 = (uint)(ushort)((ushort)(uVar34 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar34 >> 8 ^ uVar46 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar34 << 8) ^
                         ma_dr_flac__crc16_table[(uVar14 ^ uVar34) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar14 ^ uVar19 >> 8) & 0xff];
                goto LAB_0017f91c;
              }
            }
            else {
LAB_0017f91c:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar50 + 1;
            uVar7 = bs->cacheL2[uVar50];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            mVar13 = uVar42;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar42) {
              return 0;
            }
            uVar7 = bs->cache;
            mVar13 = bs->consumedBits + uVar42;
          }
          uVar49 = uVar49 | (uint)(uVar7 >> (-(byte)uVar42 & 0x3f));
          uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        }
        else {
          uVar7 = uVar7 << (bVar10 & 0x3f);
          mVar13 = uVar42 + iVar45;
        }
        bs->cache = uVar7;
        bs->consumedBits = mVar13;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar7 != 0) {
            if (uVar7 < 0x1000000000000000) {
              bVar52 = uVar7 >> 0x20 == 0;
              uVar23 = uVar7 << 0x20;
              if (!bVar52) {
                uVar23 = uVar7;
              }
              iVar39 = (uint)bVar52 * 0x20;
              iVar30 = iVar39 + 0x10;
              uVar3 = uVar23 << 0x10;
              if (0xffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar39 = iVar30 + 8;
              uVar23 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar39 = iVar30;
                uVar23 = uVar3;
              }
              iVar30 = iVar39 + 4;
              uVar3 = uVar23 << 4;
              if (0xfffffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar7 >> 0x3c) * 4);
            }
            uVar42 = iVar30 - 1;
            goto LAB_0017fa24;
          }
LAB_0017fa32:
          uVar50 = 0x40 - mVar13;
          do {
            uVar42 = bs->nextL2Line;
            if ((ulong)uVar42 < 0x200) {
              uVar19 = bs->crc16;
              uVar34 = (uint)uVar19;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar8 = bs->crc16Cache;
                uVar14 = (uint)mVar8;
                uVar2 = (ushort)(mVar8 >> 0x30);
                uVar46 = (uint)(mVar8 >> 0x10);
                uVar20 = (uint)(mVar8 >> 0x18);
                uVar17 = (uint)(mVar8 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar17 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar19 >> 8) ^
                                                       (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar19 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar19 >> 8) ^
                                                             (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar17 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar19 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar20 & 0xff] <<
                                8 ^ uVar14 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar17 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar17 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar17 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar20 & 0xff]) >> 8 & 0xff ^ uVar46 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar17 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar17 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar20 & 0xff]) >> 8 & 0xff ^ uVar46 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar17 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar19 >> 8) ^
                                                               (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar20 & 0xff] << 8 ^ uVar14 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar17 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar17 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar17 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar20 & 0xff]) >> 8 & 0xff ^ uVar46 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar14) & 0xff];
                  break;
                case 1:
                  uVar34 = (uint)(ushort)(uVar19 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
                case 2:
                  uVar34 = (uint)(ushort)((ushort)(uVar34 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar17 ^ uVar34) >> 8 & 0xff]);
                case 3:
                  uVar34 = (uint)(ushort)((ushort)(uVar34 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar17 ^ uVar34 >> 8) & 0xff]);
                case 4:
                  uVar34 = (uint)(ushort)((ushort)(uVar34 << 8) ^
                                         ma_dr_flac__crc16_table[uVar34 >> 8 ^ uVar20 & 0xff]);
                case 5:
                  uVar34 = (uint)(ushort)((ushort)(uVar34 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar34 >> 8 ^ uVar46 & 0xffff) & 0xff]);
                case 6:
                  uVar19 = (ushort)(uVar34 << 8) ^
                           ma_dr_flac__crc16_table[(uVar14 ^ uVar34) >> 8 & 0xff];
                case 7:
                  uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar14 ^ uVar19 >> 8) & 0xff];
                  goto LAB_0017fc22;
                }
              }
              else {
LAB_0017fc22:
                bs->crc16 = uVar19;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar42 + 1;
              uVar7 = bs->cacheL2[uVar42];
              uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
              bs->crc16Cache = uVar7;
              mVar13 = 0;
            }
            else {
              mVar5 = ma_dr_flac__reload_cache(bs);
              if (mVar5 == 0) {
                return 0;
              }
              uVar7 = bs->cache;
              mVar13 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              uVar42 = 0x40;
              if (uVar7 != 0) {
                if (uVar7 < 0x1000000000000000) {
                  bVar52 = uVar7 >> 0x20 == 0;
                  uVar23 = uVar7 << 0x20;
                  if (!bVar52) {
                    uVar23 = uVar7;
                  }
                  iVar39 = (uint)bVar52 * 0x20;
                  iVar30 = iVar39 + 0x10;
                  uVar3 = uVar23 << 0x10;
                  if (0xffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar39 = iVar30 + 8;
                  uVar23 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar39 = iVar30;
                    uVar23 = uVar3;
                  }
                  iVar30 = iVar39 + 4;
                  uVar3 = uVar23 << 4;
                  if (0xfffffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar7 >> 0x3c) * 4);
                }
                uVar42 = iVar30 - 1;
              }
            }
            else {
              uVar42 = (uint)LZCOUNT(uVar7);
            }
            uVar50 = uVar50 + uVar42;
          } while (0x3f < uVar42);
        }
        else {
          uVar42 = (uint)LZCOUNT(uVar7);
LAB_0017fa24:
          uVar50 = uVar42;
          if (0x3f < uVar42) goto LAB_0017fa32;
        }
        uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar13 + uVar42;
        uVar34 = (uint)(uVar7 >> (bVar12 & 0x3f));
        if (uVar24 < uVar42) {
          uVar42 = uVar42 - uVar24;
          uVar20 = bs->nextL2Line;
          if ((ulong)uVar20 < 0x200) {
            uVar19 = bs->crc16;
            uVar46 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar15 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar14 = (uint)(mVar8 >> 0x10);
              uVar17 = (uint)(mVar8 >> 0x18);
              uVar18 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar18 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar18 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar18 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar17 & 0xff] <<
                              8 ^ uVar15 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar18 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar18 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar18 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar18 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar18 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar17 & 0xff]) >> 8 & 0xff ^ uVar14 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar18 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar18 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar18 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar18 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar18 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar17 & 0xff]) >> 8 & 0xff ^ uVar14 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar18 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar18 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar18 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff] << 8 ^ uVar15 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar18 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar18 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar18 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar18 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar18 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar14 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar15) & 0xff]
                ;
                break;
              case 1:
                uVar46 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar46 = (uint)(ushort)((ushort)(uVar46 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar18 ^ uVar46) >> 8 & 0xff]);
              case 3:
                uVar46 = (uint)(ushort)((ushort)(uVar46 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar18 ^ uVar46 >> 8) & 0xff]);
              case 4:
                uVar46 = (uint)(ushort)((ushort)(uVar46 << 8) ^
                                       ma_dr_flac__crc16_table[uVar46 >> 8 ^ uVar17 & 0xff]);
              case 5:
                uVar46 = (uint)(ushort)((ushort)(uVar46 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar46 >> 8 ^ uVar14 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar46 << 8) ^
                         ma_dr_flac__crc16_table[(uVar15 ^ uVar46) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar15 ^ uVar19 >> 8) & 0xff];
                goto LAB_0017ff63;
              }
            }
            else {
LAB_0017ff63:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar20 + 1;
            uVar7 = bs->cacheL2[uVar20];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            uVar20 = uVar42;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar42) {
              return 0;
            }
            uVar7 = bs->cache;
            uVar20 = bs->consumedBits + uVar42;
          }
          uVar34 = uVar34 | (uint)(uVar7 >> (-(byte)uVar42 & 0x3f));
          mVar8 = uVar7 << ((byte)uVar42 & 0x3f);
        }
        else {
          mVar8 = uVar7 << (bVar10 & 0x3f);
          uVar20 = uVar42 + iVar45;
        }
        bs->cache = mVar8;
        bs->consumedBits = uVar20;
        uVar20 = local_108 << (riceParam & 0x1f) | local_e8 & uVar27;
        uVar46 = uVar4 << (riceParam & 0x1f) | local_110 & uVar27;
        uVar49 = uVar25 << (riceParam & 0x1f) | uVar49 & uVar27;
        uVar50 = uVar50 << (riceParam & 0x1f) | uVar34 & uVar27;
        uVar42 = *(uint *)(&DAT_0018fa00 + (ulong)(uVar46 & 1) * 4);
        uVar4 = *(uint *)(&DAT_0018fa00 + (ulong)(uVar49 & 1) * 4);
        uVar25 = *(uint *)(&DAT_0018fa00 + (ulong)(uVar50 & 1) * 4);
        iVar35 = lpcOrder - 1;
        iVar31 = 0;
        local_5c = 0;
        local_dc = 0;
        local_d8 = 0;
        local_d4 = 0;
        local_d0 = 0;
        local_cc = 0;
        local_c8 = 0;
        local_c4 = 0;
        local_c0 = 0;
        local_bc = 0;
        local_b8 = 0;
        local_b4 = 0;
        local_b0 = 0;
        local_ac = 0;
        local_a8 = 0;
        iVar30 = 0;
        iVar39 = 0;
        iVar41 = 0;
        iVar21 = 0;
        iVar43 = 0;
        iVar47 = 0;
        iVar6 = 0;
        iVar28 = 0;
        iVar29 = 0;
        iVar38 = 0;
        iVar33 = 0;
        iVar16 = 0;
        iVar36 = 0;
        iVar40 = 0;
        iVar22 = 0;
        iVar26 = 0;
        switch(iVar35) {
        case 0x1f:
          local_5c = pSamplesOut[-0x20] * coefficients[0x1f];
        case 0x1e:
          local_dc = pSamplesOut[-0x1f] * coefficients[0x1e] + local_5c;
        case 0x1d:
          local_d8 = pSamplesOut[-0x1e] * coefficients[0x1d] + local_dc;
        case 0x1c:
          local_d4 = pSamplesOut[-0x1d] * coefficients[0x1c] + local_d8;
        case 0x1b:
          local_d0 = pSamplesOut[-0x1c] * coefficients[0x1b] + local_d4;
        case 0x1a:
          local_cc = pSamplesOut[-0x1b] * coefficients[0x1a] + local_d0;
        case 0x19:
          local_c8 = pSamplesOut[-0x1a] * coefficients[0x19] + local_cc;
        case 0x18:
          local_c4 = pSamplesOut[-0x19] * coefficients[0x18] + local_c8;
        case 0x17:
          local_c0 = pSamplesOut[-0x18] * coefficients[0x17] + local_c4;
        case 0x16:
          local_bc = pSamplesOut[-0x17] * coefficients[0x16] + local_c0;
        case 0x15:
          local_b8 = pSamplesOut[-0x16] * coefficients[0x15] + local_bc;
        case 0x14:
          local_b4 = pSamplesOut[-0x15] * coefficients[0x14] + local_b8;
        case 0x13:
          local_b0 = pSamplesOut[-0x14] * coefficients[0x13] + local_b4;
        case 0x12:
          local_ac = pSamplesOut[-0x13] * coefficients[0x12] + local_b0;
        case 0x11:
          local_a8 = pSamplesOut[-0x12] * coefficients[0x11] + local_ac;
        case 0x10:
          iVar30 = pSamplesOut[-0x11] * coefficients[0x10] + local_a8;
        case 0xf:
          iVar39 = pSamplesOut[-0x10] * coefficients[0xf] + iVar30;
        case 0xe:
          iVar41 = pSamplesOut[-0xf] * coefficients[0xe] + iVar39;
        case 0xd:
          iVar21 = pSamplesOut[-0xe] * coefficients[0xd] + iVar41;
        case 0xc:
          iVar43 = pSamplesOut[-0xd] * coefficients[0xc] + iVar21;
        case 0xb:
          iVar47 = pSamplesOut[-0xc] * coefficients[0xb] + iVar43;
        case 10:
          iVar6 = pSamplesOut[-0xb] * coefficients[10] + iVar47;
        case 9:
          iVar28 = pSamplesOut[-10] * coefficients[9] + iVar6;
        case 8:
          iVar29 = pSamplesOut[-9] * coefficients[8] + iVar28;
        case 7:
          iVar38 = pSamplesOut[-8] * coefficients[7] + iVar29;
        case 6:
          iVar33 = pSamplesOut[-7] * coefficients[6] + iVar38;
        case 5:
          iVar16 = pSamplesOut[-6] * coefficients[5] + iVar33;
        case 4:
          iVar36 = pSamplesOut[-5] * coefficients[4] + iVar16;
        case 3:
          iVar40 = pSamplesOut[-4] * coefficients[3] + iVar36;
        case 2:
          iVar22 = pSamplesOut[-3] * coefficients[2] + iVar40;
        case 1:
          iVar26 = pSamplesOut[-2] * coefficients[1] + iVar22;
        case 0:
          iVar31 = pSamplesOut[-1] * *coefficients + iVar26;
        }
        iVar39 = 0;
        iVar30 = (iVar31 >> (bVar11 & 0x1f)) +
                 (uVar20 >> 1 ^ *(uint *)(&DAT_0018fa00 + (ulong)(uVar20 & 1) * 4));
        *pSamplesOut = iVar30;
        switch(iVar35) {
        case 0x1f:
          iVar39 = pSamplesOut[-0x1f] * coefficients[0x1f];
        case 0x1e:
          iVar39 = iVar39 + pSamplesOut[-0x1e] * coefficients[0x1e];
        case 0x1d:
          iVar39 = iVar39 + pSamplesOut[-0x1d] * coefficients[0x1d];
        case 0x1c:
          iVar39 = iVar39 + pSamplesOut[-0x1c] * coefficients[0x1c];
        case 0x1b:
          iVar39 = iVar39 + pSamplesOut[-0x1b] * coefficients[0x1b];
        case 0x1a:
          iVar39 = iVar39 + pSamplesOut[-0x1a] * coefficients[0x1a];
        case 0x19:
          iVar39 = iVar39 + pSamplesOut[-0x19] * coefficients[0x19];
        case 0x18:
          iVar39 = iVar39 + pSamplesOut[-0x18] * coefficients[0x18];
        case 0x17:
          iVar39 = iVar39 + pSamplesOut[-0x17] * coefficients[0x17];
        case 0x16:
          iVar39 = iVar39 + pSamplesOut[-0x16] * coefficients[0x16];
        case 0x15:
          iVar39 = iVar39 + pSamplesOut[-0x15] * coefficients[0x15];
        case 0x14:
          iVar39 = iVar39 + pSamplesOut[-0x14] * coefficients[0x14];
        case 0x13:
          iVar39 = iVar39 + pSamplesOut[-0x13] * coefficients[0x13];
        case 0x12:
          iVar39 = iVar39 + pSamplesOut[-0x12] * coefficients[0x12];
        case 0x11:
          iVar39 = iVar39 + pSamplesOut[-0x11] * coefficients[0x11];
        case 0x10:
          iVar39 = iVar39 + pSamplesOut[-0x10] * coefficients[0x10];
        case 0xf:
          iVar39 = iVar39 + pSamplesOut[-0xf] * coefficients[0xf];
        case 0xe:
          iVar39 = iVar39 + pSamplesOut[-0xe] * coefficients[0xe];
        case 0xd:
          iVar39 = iVar39 + pSamplesOut[-0xd] * coefficients[0xd];
        case 0xc:
          iVar39 = iVar39 + pSamplesOut[-0xc] * coefficients[0xc];
        case 0xb:
          iVar39 = iVar39 + pSamplesOut[-0xb] * coefficients[0xb];
        case 10:
          iVar39 = iVar39 + pSamplesOut[-10] * coefficients[10];
        case 9:
          iVar39 = iVar39 + pSamplesOut[-9] * coefficients[9];
        case 8:
          iVar39 = iVar39 + pSamplesOut[-8] * coefficients[8];
        case 7:
          iVar39 = iVar39 + pSamplesOut[-7] * coefficients[7];
        case 6:
          iVar39 = iVar39 + pSamplesOut[-6] * coefficients[6];
        case 5:
          iVar39 = iVar39 + pSamplesOut[-5] * coefficients[5];
        case 4:
          iVar39 = iVar39 + pSamplesOut[-4] * coefficients[4];
        case 3:
          iVar39 = iVar39 + pSamplesOut[-3] * coefficients[3];
        case 2:
          iVar39 = iVar39 + pSamplesOut[-2] * coefficients[2];
        case 1:
          iVar39 = iVar39 + pSamplesOut[-1] * coefficients[1];
        case 0:
          iVar39 = iVar39 + *coefficients * iVar30;
        }
        iVar33 = (iVar39 >> (bVar11 & 0x1f)) + (uVar46 >> 1 ^ uVar42);
        pSamplesOut[1] = iVar33;
        iVar43 = 0;
        local_dc = 0;
        local_d8 = 0;
        local_d4 = 0;
        local_d0 = 0;
        local_cc = 0;
        local_c8 = 0;
        local_c4 = 0;
        local_c0 = 0;
        local_bc = 0;
        local_b8 = 0;
        local_b4 = 0;
        local_b0 = 0;
        local_ac = 0;
        local_a8 = 0;
        iVar39 = 0;
        iVar41 = 0;
        iVar6 = 0;
        iVar22 = 0;
        iVar44 = 0;
        iVar48 = 0;
        iVar16 = 0;
        iVar29 = 0;
        iVar36 = 0;
        iVar40 = 0;
        iVar21 = 0;
        iVar38 = 0;
        iVar47 = 0;
        iVar31 = 0;
        iVar26 = 0;
        iVar28 = 0;
        iVar51 = 0;
        switch(iVar35) {
        case 0x1f:
          local_dc = pSamplesOut[-0x1e] * coefficients[0x1f];
        case 0x1e:
          local_d8 = pSamplesOut[-0x1d] * coefficients[0x1e] + local_dc;
        case 0x1d:
          local_d4 = pSamplesOut[-0x1c] * coefficients[0x1d] + local_d8;
        case 0x1c:
          local_d0 = pSamplesOut[-0x1b] * coefficients[0x1c] + local_d4;
        case 0x1b:
          local_cc = pSamplesOut[-0x1a] * coefficients[0x1b] + local_d0;
        case 0x1a:
          local_c8 = pSamplesOut[-0x19] * coefficients[0x1a] + local_cc;
        case 0x19:
          local_c4 = pSamplesOut[-0x18] * coefficients[0x19] + local_c8;
        case 0x18:
          local_c0 = pSamplesOut[-0x17] * coefficients[0x18] + local_c4;
        case 0x17:
          local_bc = pSamplesOut[-0x16] * coefficients[0x17] + local_c0;
        case 0x16:
          local_b8 = pSamplesOut[-0x15] * coefficients[0x16] + local_bc;
        case 0x15:
          local_b4 = pSamplesOut[-0x14] * coefficients[0x15] + local_b8;
        case 0x14:
          local_b0 = pSamplesOut[-0x13] * coefficients[0x14] + local_b4;
        case 0x13:
          local_ac = pSamplesOut[-0x12] * coefficients[0x13] + local_b0;
        case 0x12:
          local_a8 = pSamplesOut[-0x11] * coefficients[0x12] + local_ac;
        case 0x11:
          iVar39 = pSamplesOut[-0x10] * coefficients[0x11] + local_a8;
        case 0x10:
          iVar41 = pSamplesOut[-0xf] * coefficients[0x10] + iVar39;
        case 0xf:
          iVar6 = pSamplesOut[-0xe] * coefficients[0xf] + iVar41;
        case 0xe:
          iVar22 = pSamplesOut[-0xd] * coefficients[0xe] + iVar6;
        case 0xd:
          iVar44 = pSamplesOut[-0xc] * coefficients[0xd] + iVar22;
        case 0xc:
          iVar48 = pSamplesOut[-0xb] * coefficients[0xc] + iVar44;
        case 0xb:
          iVar16 = pSamplesOut[-10] * coefficients[0xb] + iVar48;
        case 10:
          iVar29 = pSamplesOut[-9] * coefficients[10] + iVar16;
        case 9:
          iVar36 = pSamplesOut[-8] * coefficients[9] + iVar29;
        case 8:
          iVar40 = pSamplesOut[-7] * coefficients[8] + iVar36;
        case 7:
          iVar21 = pSamplesOut[-6] * coefficients[7] + iVar40;
        case 6:
          iVar38 = pSamplesOut[-5] * coefficients[6] + iVar21;
        case 5:
          iVar47 = pSamplesOut[-4] * coefficients[5] + iVar38;
        case 4:
          iVar31 = pSamplesOut[-3] * coefficients[4] + iVar47;
        case 3:
          iVar26 = pSamplesOut[-2] * coefficients[3] + iVar31;
        case 2:
          iVar28 = pSamplesOut[-1] * coefficients[2] + iVar26;
        case 1:
          iVar51 = coefficients[1] * iVar30 + iVar28;
        case 0:
          iVar43 = *coefficients * iVar33 + iVar51;
        }
        iVar41 = 0;
        iVar39 = (iVar43 >> (bVar11 & 0x1f)) + (uVar49 >> 1 ^ uVar4);
        pSamplesOut[2] = iVar39;
        switch(iVar35) {
        case 0x1f:
          iVar41 = pSamplesOut[-0x1d] * coefficients[0x1f];
        case 0x1e:
          iVar41 = iVar41 + pSamplesOut[-0x1c] * coefficients[0x1e];
        case 0x1d:
          iVar41 = iVar41 + pSamplesOut[-0x1b] * coefficients[0x1d];
        case 0x1c:
          iVar41 = iVar41 + pSamplesOut[-0x1a] * coefficients[0x1c];
        case 0x1b:
          iVar41 = iVar41 + pSamplesOut[-0x19] * coefficients[0x1b];
        case 0x1a:
          iVar41 = iVar41 + pSamplesOut[-0x18] * coefficients[0x1a];
        case 0x19:
          iVar41 = iVar41 + pSamplesOut[-0x17] * coefficients[0x19];
        case 0x18:
          iVar41 = iVar41 + pSamplesOut[-0x16] * coefficients[0x18];
        case 0x17:
          iVar41 = iVar41 + pSamplesOut[-0x15] * coefficients[0x17];
        case 0x16:
          iVar41 = iVar41 + pSamplesOut[-0x14] * coefficients[0x16];
        case 0x15:
          iVar41 = iVar41 + pSamplesOut[-0x13] * coefficients[0x15];
        case 0x14:
          iVar41 = iVar41 + pSamplesOut[-0x12] * coefficients[0x14];
        case 0x13:
          iVar41 = iVar41 + pSamplesOut[-0x11] * coefficients[0x13];
        case 0x12:
          iVar41 = iVar41 + pSamplesOut[-0x10] * coefficients[0x12];
        case 0x11:
          iVar41 = iVar41 + pSamplesOut[-0xf] * coefficients[0x11];
        case 0x10:
          iVar41 = iVar41 + pSamplesOut[-0xe] * coefficients[0x10];
        case 0xf:
          iVar41 = iVar41 + pSamplesOut[-0xd] * coefficients[0xf];
        case 0xe:
          iVar41 = iVar41 + pSamplesOut[-0xc] * coefficients[0xe];
        case 0xd:
          iVar41 = iVar41 + pSamplesOut[-0xb] * coefficients[0xd];
        case 0xc:
          iVar41 = iVar41 + pSamplesOut[-10] * coefficients[0xc];
        case 0xb:
          iVar41 = iVar41 + pSamplesOut[-9] * coefficients[0xb];
        case 10:
          iVar41 = iVar41 + pSamplesOut[-8] * coefficients[10];
        case 9:
          iVar41 = iVar41 + pSamplesOut[-7] * coefficients[9];
        case 8:
          iVar41 = iVar41 + pSamplesOut[-6] * coefficients[8];
        case 7:
          iVar41 = iVar41 + pSamplesOut[-5] * coefficients[7];
        case 6:
          iVar41 = iVar41 + pSamplesOut[-4] * coefficients[6];
        case 5:
          iVar41 = iVar41 + pSamplesOut[-3] * coefficients[5];
        case 4:
          iVar41 = iVar41 + pSamplesOut[-2] * coefficients[4];
        case 3:
          iVar41 = iVar41 + pSamplesOut[-1] * coefficients[3];
        case 2:
          iVar41 = iVar41 + iVar30 * coefficients[2];
        case 1:
          iVar41 = iVar41 + iVar33 * coefficients[1];
        case 0:
          iVar41 = iVar41 + iVar39 * *coefficients;
        default:
          pSamplesOut[3] = (iVar41 >> (bVar11 & 0x1f)) + (uVar50 >> 1 ^ uVar25);
          pSamplesOut = pSamplesOut + 4;
        }
      }
    }
    else {
      while (pSamplesOut < piVar1) {
        uVar7 = bs->cache;
        mVar13 = bs->consumedBits;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar7 != 0) {
            if (uVar7 < 0x1000000000000000) {
              bVar52 = uVar7 >> 0x20 == 0;
              uVar23 = uVar7 << 0x20;
              if (!bVar52) {
                uVar23 = uVar7;
              }
              iVar39 = (uint)bVar52 * 0x20;
              iVar30 = iVar39 + 0x10;
              uVar3 = uVar23 << 0x10;
              if (0xffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar39 = iVar30 + 8;
              uVar23 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar39 = iVar30;
                uVar23 = uVar3;
              }
              iVar30 = iVar39 + 4;
              uVar3 = uVar23 << 4;
              if (0xfffffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar7 >> 0x3c) * 4);
            }
            uVar42 = iVar30 - 1;
            goto LAB_00180c14;
          }
LAB_00180c23:
          local_108 = 0x40 - mVar13;
          do {
            uVar42 = bs->nextL2Line;
            if ((ulong)uVar42 < 0x200) {
              uVar19 = bs->crc16;
              uVar4 = (uint)uVar19;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar8 = bs->crc16Cache;
                uVar34 = (uint)mVar8;
                uVar2 = (ushort)(mVar8 >> 0x30);
                uVar49 = (uint)(mVar8 >> 0x10);
                uVar25 = (uint)(mVar8 >> 0x18);
                uVar50 = (uint)(mVar8 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar50 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar19 >> 8) ^
                                                       (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar19 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar19 >> 8) ^
                                                             (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar50 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar19 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar25 & 0xff] <<
                                8 ^ uVar34 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar50 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar50 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar50 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar25 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar50 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar50 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar25 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar50 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar19 >> 8) ^
                                                               (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar25 & 0xff] << 8 ^ uVar34 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar50 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar50 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar50 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar25 & 0xff]) >> 8 & 0xff ^ uVar49 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar34) & 0xff];
                  break;
                case 1:
                  uVar4 = (uint)(ushort)(uVar19 << 8 ^
                                        ma_dr_flac__crc16_table
                                        [(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
                case 2:
                  uVar4 = (uint)(ushort)((ushort)(uVar4 << 8) ^
                                        ma_dr_flac__crc16_table[(uVar50 ^ uVar4) >> 8 & 0xff]);
                case 3:
                  uVar4 = (uint)(ushort)((ushort)(uVar4 << 8) ^
                                        ma_dr_flac__crc16_table[(uVar50 ^ uVar4 >> 8) & 0xff]);
                case 4:
                  uVar4 = (uint)(ushort)((ushort)(uVar4 << 8) ^
                                        ma_dr_flac__crc16_table[uVar4 >> 8 ^ uVar25 & 0xff]);
                case 5:
                  uVar4 = (uint)(ushort)((ushort)(uVar4 << 8) ^
                                        ma_dr_flac__crc16_table
                                        [(uVar4 >> 8 ^ uVar49 & 0xffff) & 0xff]);
                case 6:
                  uVar19 = (ushort)(uVar4 << 8) ^
                           ma_dr_flac__crc16_table[(uVar34 ^ uVar4) >> 8 & 0xff];
                case 7:
                  uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar34 ^ uVar19 >> 8) & 0xff];
                  goto LAB_00180e15;
                }
              }
              else {
LAB_00180e15:
                bs->crc16 = uVar19;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar42 + 1;
              uVar7 = bs->cacheL2[uVar42];
              uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
              bs->crc16Cache = uVar7;
              mVar13 = 0;
            }
            else {
              mVar5 = ma_dr_flac__reload_cache(bs);
              if (mVar5 == 0) {
                return 0;
              }
              uVar7 = bs->cache;
              mVar13 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              uVar42 = 0x40;
              if (uVar7 != 0) {
                if (uVar7 < 0x1000000000000000) {
                  bVar52 = uVar7 >> 0x20 == 0;
                  uVar23 = uVar7 << 0x20;
                  if (!bVar52) {
                    uVar23 = uVar7;
                  }
                  iVar39 = (uint)bVar52 * 0x20;
                  iVar30 = iVar39 + 0x10;
                  uVar3 = uVar23 << 0x10;
                  if (0xffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar39 = iVar30 + 8;
                  uVar23 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar39 = iVar30;
                    uVar23 = uVar3;
                  }
                  iVar30 = iVar39 + 4;
                  uVar3 = uVar23 << 4;
                  if (0xfffffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar7 >> 0x3c) * 4);
                }
                uVar42 = iVar30 - 1;
              }
            }
            else {
              uVar42 = (uint)LZCOUNT(uVar7);
            }
            local_108 = local_108 + uVar42;
          } while (0x3f < uVar42);
        }
        else {
          uVar42 = (uint)LZCOUNT(uVar7);
LAB_00180c14:
          local_108 = uVar42;
          if (0x3f < uVar42) goto LAB_00180c23;
        }
        uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar13 + uVar42;
        local_e8 = (uint)(uVar7 >> (bVar12 & 0x3f));
        if (uVar24 < uVar42) {
          uVar42 = uVar42 - uVar24;
          uVar4 = bs->nextL2Line;
          if ((ulong)uVar4 < 0x200) {
            uVar19 = bs->crc16;
            uVar25 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar20 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar50 = (uint)(mVar8 >> 0x10);
              uVar49 = (uint)(mVar8 >> 0x18);
              uVar34 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar34 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar34 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar49 & 0xff] <<
                              8 ^ uVar20 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar34 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar34 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar34 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar34 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar34 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar34 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar49 & 0xff] << 8 ^ uVar20 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar34 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar34 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar20) & 0xff]
                ;
                break;
              case 1:
                uVar25 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar34 ^ uVar25) >> 8 & 0xff]);
              case 3:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar34 ^ uVar25 >> 8) & 0xff]);
              case 4:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[uVar25 >> 8 ^ uVar49 & 0xff]);
              case 5:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar25 >> 8 ^ uVar50 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar25 << 8) ^
                         ma_dr_flac__crc16_table[(uVar20 ^ uVar25) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar20 ^ uVar19 >> 8) & 0xff];
                goto LAB_00181144;
              }
            }
            else {
LAB_00181144:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar4 + 1;
            uVar7 = bs->cacheL2[uVar4];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            mVar13 = uVar42;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar42) {
              return 0;
            }
            uVar7 = bs->cache;
            mVar13 = bs->consumedBits + uVar42;
          }
          local_e8 = local_e8 | (uint)(uVar7 >> (-(byte)uVar42 & 0x3f));
          uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        }
        else {
          uVar7 = uVar7 << (bVar10 & 0x3f);
          mVar13 = uVar42 + iVar45;
        }
        bs->cache = uVar7;
        bs->consumedBits = mVar13;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar7 != 0) {
            if (uVar7 < 0x1000000000000000) {
              bVar52 = uVar7 >> 0x20 == 0;
              uVar23 = uVar7 << 0x20;
              if (!bVar52) {
                uVar23 = uVar7;
              }
              iVar39 = (uint)bVar52 * 0x20;
              iVar30 = iVar39 + 0x10;
              uVar3 = uVar23 << 0x10;
              if (0xffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar39 = iVar30 + 8;
              uVar23 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar39 = iVar30;
                uVar23 = uVar3;
              }
              iVar30 = iVar39 + 4;
              uVar3 = uVar23 << 4;
              if (0xfffffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar7 >> 0x3c) * 4);
            }
            uVar42 = iVar30 - 1;
            goto LAB_00181249;
          }
LAB_00181257:
          uVar4 = 0x40 - mVar13;
          do {
            uVar42 = bs->nextL2Line;
            if ((ulong)uVar42 < 0x200) {
              uVar19 = bs->crc16;
              uVar25 = (uint)uVar19;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar8 = bs->crc16Cache;
                uVar20 = (uint)mVar8;
                uVar2 = (ushort)(mVar8 >> 0x30);
                uVar50 = (uint)(mVar8 >> 0x10);
                uVar49 = (uint)(mVar8 >> 0x18);
                uVar34 = (uint)(mVar8 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar34 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar19 >> 8) ^
                                                       (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar19 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar19 >> 8) ^
                                                             (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar34 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar19 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar49 & 0xff] <<
                                8 ^ uVar20 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar34 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar34 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar34 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar34 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar34 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar34 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar19 >> 8) ^
                                                               (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar49 & 0xff] << 8 ^ uVar20 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar34 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar20) & 0xff];
                  break;
                case 1:
                  uVar25 = (uint)(ushort)(uVar19 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
                case 2:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar34 ^ uVar25) >> 8 & 0xff]);
                case 3:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar34 ^ uVar25 >> 8) & 0xff]);
                case 4:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table[uVar25 >> 8 ^ uVar49 & 0xff]);
                case 5:
                  uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar25 >> 8 ^ uVar50 & 0xffff) & 0xff]);
                case 6:
                  uVar19 = (ushort)(uVar25 << 8) ^
                           ma_dr_flac__crc16_table[(uVar20 ^ uVar25) >> 8 & 0xff];
                case 7:
                  uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar20 ^ uVar19 >> 8) & 0xff];
                  goto LAB_00181447;
                }
              }
              else {
LAB_00181447:
                bs->crc16 = uVar19;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar42 + 1;
              uVar7 = bs->cacheL2[uVar42];
              uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
              bs->crc16Cache = uVar7;
              mVar13 = 0;
            }
            else {
              mVar5 = ma_dr_flac__reload_cache(bs);
              if (mVar5 == 0) {
                return 0;
              }
              uVar7 = bs->cache;
              mVar13 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              uVar42 = 0x40;
              if (uVar7 != 0) {
                if (uVar7 < 0x1000000000000000) {
                  bVar52 = uVar7 >> 0x20 == 0;
                  uVar23 = uVar7 << 0x20;
                  if (!bVar52) {
                    uVar23 = uVar7;
                  }
                  iVar39 = (uint)bVar52 * 0x20;
                  iVar30 = iVar39 + 0x10;
                  uVar3 = uVar23 << 0x10;
                  if (0xffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar39 = iVar30 + 8;
                  uVar23 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar39 = iVar30;
                    uVar23 = uVar3;
                  }
                  iVar30 = iVar39 + 4;
                  uVar3 = uVar23 << 4;
                  if (0xfffffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar7 >> 0x3c) * 4);
                }
                uVar42 = iVar30 - 1;
              }
            }
            else {
              uVar42 = (uint)LZCOUNT(uVar7);
            }
            uVar4 = uVar4 + uVar42;
          } while (0x3f < uVar42);
        }
        else {
          uVar42 = (uint)LZCOUNT(uVar7);
LAB_00181249:
          uVar4 = uVar42;
          if (0x3f < uVar42) goto LAB_00181257;
        }
        uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar13 + uVar42;
        local_110 = (uint)(uVar7 >> (bVar12 & 0x3f));
        if (uVar24 < uVar42) {
          uVar42 = uVar42 - uVar24;
          uVar25 = bs->nextL2Line;
          if ((ulong)uVar25 < 0x200) {
            uVar19 = bs->crc16;
            uVar49 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar46 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar34 = (uint)(mVar8 >> 0x10);
              uVar50 = (uint)(mVar8 >> 0x18);
              uVar20 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar20 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar20 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar50 & 0xff] <<
                              8 ^ uVar46 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar20 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar20 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar20 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar20 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar20 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar20 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar50 & 0xff] << 8 ^ uVar46 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar20 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar20 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar46) & 0xff]
                ;
                break;
              case 1:
                uVar49 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar20 ^ uVar49) >> 8 & 0xff]);
              case 3:
                uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar20 ^ uVar49 >> 8) & 0xff]);
              case 4:
                uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                       ma_dr_flac__crc16_table[uVar49 >> 8 ^ uVar50 & 0xff]);
              case 5:
                uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar49 >> 8 ^ uVar34 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar49 << 8) ^
                         ma_dr_flac__crc16_table[(uVar46 ^ uVar49) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar46 ^ uVar19 >> 8) & 0xff];
                goto LAB_00181774;
              }
            }
            else {
LAB_00181774:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar25 + 1;
            uVar7 = bs->cacheL2[uVar25];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            mVar13 = uVar42;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar42) {
              return 0;
            }
            uVar7 = bs->cache;
            mVar13 = bs->consumedBits + uVar42;
          }
          local_110 = local_110 | (uint)(uVar7 >> (-(byte)uVar42 & 0x3f));
          uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        }
        else {
          uVar7 = uVar7 << (bVar10 & 0x3f);
          mVar13 = uVar42 + iVar45;
        }
        bs->cache = uVar7;
        bs->consumedBits = mVar13;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar7 != 0) {
            if (uVar7 < 0x1000000000000000) {
              bVar52 = uVar7 >> 0x20 == 0;
              uVar23 = uVar7 << 0x20;
              if (!bVar52) {
                uVar23 = uVar7;
              }
              iVar39 = (uint)bVar52 * 0x20;
              iVar30 = iVar39 + 0x10;
              uVar3 = uVar23 << 0x10;
              if (0xffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar39 = iVar30 + 8;
              uVar23 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar39 = iVar30;
                uVar23 = uVar3;
              }
              iVar30 = iVar39 + 4;
              uVar3 = uVar23 << 4;
              if (0xfffffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar7 >> 0x3c) * 4);
            }
            uVar42 = iVar30 - 1;
            goto LAB_00181875;
          }
LAB_00181881:
          uVar25 = 0x40 - mVar13;
          do {
            uVar42 = bs->nextL2Line;
            if ((ulong)uVar42 < 0x200) {
              uVar19 = bs->crc16;
              uVar49 = (uint)uVar19;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar8 = bs->crc16Cache;
                uVar46 = (uint)mVar8;
                uVar2 = (ushort)(mVar8 >> 0x30);
                uVar34 = (uint)(mVar8 >> 0x10);
                uVar50 = (uint)(mVar8 >> 0x18);
                uVar20 = (uint)(mVar8 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar20 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar19 >> 8) ^
                                                       (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar19 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar19 >> 8) ^
                                                             (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar20 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar19 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar50 & 0xff] <<
                                8 ^ uVar46 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar20 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar20 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar20 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar20 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar20 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar20 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar19 >> 8) ^
                                                               (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar50 & 0xff] << 8 ^ uVar46 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar20 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar20 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar20 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar50 & 0xff]) >> 8 & 0xff ^ uVar34 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar46) & 0xff];
                  break;
                case 1:
                  uVar49 = (uint)(ushort)(uVar19 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
                case 2:
                  uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar20 ^ uVar49) >> 8 & 0xff]);
                case 3:
                  uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar20 ^ uVar49 >> 8) & 0xff]);
                case 4:
                  uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                         ma_dr_flac__crc16_table[uVar49 >> 8 ^ uVar50 & 0xff]);
                case 5:
                  uVar49 = (uint)(ushort)((ushort)(uVar49 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar49 >> 8 ^ uVar34 & 0xffff) & 0xff]);
                case 6:
                  uVar19 = (ushort)(uVar49 << 8) ^
                           ma_dr_flac__crc16_table[(uVar46 ^ uVar49) >> 8 & 0xff];
                case 7:
                  uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar46 ^ uVar19 >> 8) & 0xff];
                  goto LAB_00181a70;
                }
              }
              else {
LAB_00181a70:
                bs->crc16 = uVar19;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar42 + 1;
              uVar7 = bs->cacheL2[uVar42];
              uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
              bs->crc16Cache = uVar7;
              mVar13 = 0;
            }
            else {
              mVar5 = ma_dr_flac__reload_cache(bs);
              if (mVar5 == 0) {
                return 0;
              }
              uVar7 = bs->cache;
              mVar13 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              uVar42 = 0x40;
              if (uVar7 != 0) {
                if (uVar7 < 0x1000000000000000) {
                  bVar52 = uVar7 >> 0x20 == 0;
                  uVar23 = uVar7 << 0x20;
                  if (!bVar52) {
                    uVar23 = uVar7;
                  }
                  iVar39 = (uint)bVar52 * 0x20;
                  iVar30 = iVar39 + 0x10;
                  uVar3 = uVar23 << 0x10;
                  if (0xffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar39 = iVar30 + 8;
                  uVar23 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar39 = iVar30;
                    uVar23 = uVar3;
                  }
                  iVar30 = iVar39 + 4;
                  uVar3 = uVar23 << 4;
                  if (0xfffffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar7 >> 0x3c) * 4);
                }
                uVar42 = iVar30 - 1;
              }
            }
            else {
              uVar42 = (uint)LZCOUNT(uVar7);
            }
            uVar25 = uVar25 + uVar42;
          } while (0x3f < uVar42);
        }
        else {
          uVar42 = (uint)LZCOUNT(uVar7);
LAB_00181875:
          uVar25 = uVar42;
          if (0x3f < uVar42) goto LAB_00181881;
        }
        uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar13 + uVar42;
        local_a0 = (uint)(uVar7 >> (bVar12 & 0x3f));
        if (uVar24 < uVar42) {
          uVar42 = uVar42 - uVar24;
          uVar49 = bs->nextL2Line;
          if ((ulong)uVar49 < 0x200) {
            uVar19 = bs->crc16;
            uVar50 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar17 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar20 = (uint)(mVar8 >> 0x10);
              uVar34 = (uint)(mVar8 >> 0x18);
              uVar46 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar46 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar46 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar34 & 0xff] <<
                              8 ^ uVar17 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar46 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar46 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar34 & 0xff]) >> 8 & 0xff ^ uVar20 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar46 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar46 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar46 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar34 & 0xff]) >> 8 & 0xff ^ uVar20 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar46 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar34 & 0xff] << 8 ^ uVar17 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar46 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar46 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar34 & 0xff]) >> 8 & 0xff ^ uVar20 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar17) & 0xff]
                ;
                break;
              case 1:
                uVar50 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar46 ^ uVar50) >> 8 & 0xff]);
              case 3:
                uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar46 ^ uVar50 >> 8) & 0xff]);
              case 4:
                uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                       ma_dr_flac__crc16_table[uVar50 >> 8 ^ uVar34 & 0xff]);
              case 5:
                uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar50 >> 8 ^ uVar20 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar50 << 8) ^
                         ma_dr_flac__crc16_table[(uVar17 ^ uVar50) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar17 ^ uVar19 >> 8) & 0xff];
                goto LAB_00181daf;
              }
            }
            else {
LAB_00181daf:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar49 + 1;
            uVar7 = bs->cacheL2[uVar49];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            mVar13 = uVar42;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar42) {
              return 0;
            }
            uVar7 = bs->cache;
            mVar13 = bs->consumedBits + uVar42;
          }
          local_a0 = local_a0 | (uint)(uVar7 >> (-(byte)uVar42 & 0x3f));
          uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        }
        else {
          uVar7 = uVar7 << (bVar10 & 0x3f);
          mVar13 = uVar42 + iVar45;
        }
        bs->cache = uVar7;
        bs->consumedBits = mVar13;
        if (ma_dr_flac__gIsLZCNTSupported == 0) {
          if (uVar7 != 0) {
            if (uVar7 < 0x1000000000000000) {
              bVar52 = uVar7 >> 0x20 == 0;
              uVar23 = uVar7 << 0x20;
              if (!bVar52) {
                uVar23 = uVar7;
              }
              iVar39 = (uint)bVar52 * 0x20;
              iVar30 = iVar39 + 0x10;
              uVar3 = uVar23 << 0x10;
              if (0xffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar39 = iVar30 + 8;
              uVar23 = uVar3 << 8;
              if (0xffffffffffffff < uVar3) {
                iVar39 = iVar30;
                uVar23 = uVar3;
              }
              iVar30 = iVar39 + 4;
              uVar3 = uVar23 << 4;
              if (0xfffffffffffffff < uVar23) {
                iVar30 = iVar39;
                uVar3 = uVar23;
              }
              iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar3 >> 0x3c) * 4);
            }
            else {
              iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                               (uVar7 >> 0x3c) * 4);
            }
            uVar42 = iVar30 - 1;
            goto LAB_00181eb8;
          }
LAB_00181ec6:
          uVar49 = 0x40 - mVar13;
          do {
            uVar42 = bs->nextL2Line;
            if ((ulong)uVar42 < 0x200) {
              uVar19 = bs->crc16;
              uVar50 = (uint)uVar19;
              if (bs->crc16CacheIgnoredBytes < 8) {
                mVar8 = bs->crc16Cache;
                uVar17 = (uint)mVar8;
                uVar2 = (ushort)(mVar8 >> 0x30);
                uVar20 = (uint)(mVar8 >> 0x10);
                uVar34 = (uint)(mVar8 >> 0x18);
                uVar46 = (uint)(mVar8 >> 0x20);
                switch(bs->crc16CacheIgnoredBytes) {
                case 0:
                  bs->crc16 = ma_dr_flac__crc16_table
                              [((uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar46 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar19 >> 8) ^
                                                       (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar2 ^
                                                      ((uint)uVar19 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar19 >> 8) ^
                                                             (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uVar46 >> 8 ^
                                                               ((uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)]
                                                                << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar19 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar34 & 0xff] <<
                                8 ^ uVar17 ^
                               (uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar46 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar46 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar46 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar34 & 0xff]) >> 8 & 0xff ^ uVar20 & 0xffff) & 0xff]
                               ) >> 8 & 0xff] << 8 ^
                              ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar46 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar46 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar34 & 0xff]) >> 8 & 0xff ^ uVar20 & 0xffff) &
                                        0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [((uint)ma_dr_flac__crc16_table
                                                      [(uVar46 >> 8 ^
                                                       ((uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar19 >> 8) ^
                                                               (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                       0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                               uVar34 & 0xff] << 8 ^ uVar17 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar46 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar34 & 0xff]) >> 8 & 0xff ^ uVar20 & 0xffff) &
                                              0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar17) & 0xff];
                  break;
                case 1:
                  uVar50 = (uint)(ushort)(uVar19 << 8 ^
                                         ma_dr_flac__crc16_table
                                         [(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
                case 2:
                  uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar46 ^ uVar50) >> 8 & 0xff]);
                case 3:
                  uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                         ma_dr_flac__crc16_table[(uVar46 ^ uVar50 >> 8) & 0xff]);
                case 4:
                  uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                         ma_dr_flac__crc16_table[uVar50 >> 8 ^ uVar34 & 0xff]);
                case 5:
                  uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                         ma_dr_flac__crc16_table
                                         [(uVar50 >> 8 ^ uVar20 & 0xffff) & 0xff]);
                case 6:
                  uVar19 = (ushort)(uVar50 << 8) ^
                           ma_dr_flac__crc16_table[(uVar17 ^ uVar50) >> 8 & 0xff];
                case 7:
                  uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar17 ^ uVar19 >> 8) & 0xff];
                  goto LAB_001820b6;
                }
              }
              else {
LAB_001820b6:
                bs->crc16 = uVar19;
                bs->crc16CacheIgnoredBytes = 0;
              }
              bs->nextL2Line = uVar42 + 1;
              uVar7 = bs->cacheL2[uVar42];
              uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
              bs->crc16Cache = uVar7;
              mVar13 = 0;
            }
            else {
              mVar5 = ma_dr_flac__reload_cache(bs);
              if (mVar5 == 0) {
                return 0;
              }
              uVar7 = bs->cache;
              mVar13 = bs->consumedBits;
            }
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              uVar42 = 0x40;
              if (uVar7 != 0) {
                if (uVar7 < 0x1000000000000000) {
                  bVar52 = uVar7 >> 0x20 == 0;
                  uVar23 = uVar7 << 0x20;
                  if (!bVar52) {
                    uVar23 = uVar7;
                  }
                  iVar39 = (uint)bVar52 * 0x20;
                  iVar30 = iVar39 + 0x10;
                  uVar3 = uVar23 << 0x10;
                  if (0xffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar39 = iVar30 + 8;
                  uVar23 = uVar3 << 8;
                  if (0xffffffffffffff < uVar3) {
                    iVar39 = iVar30;
                    uVar23 = uVar3;
                  }
                  iVar30 = iVar39 + 4;
                  uVar3 = uVar23 << 4;
                  if (0xfffffffffffffff < uVar23) {
                    iVar30 = iVar39;
                    uVar3 = uVar23;
                  }
                  iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar3 >> 0x3c) * 4);
                }
                else {
                  iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                   (uVar7 >> 0x3c) * 4);
                }
                uVar42 = iVar30 - 1;
              }
            }
            else {
              uVar42 = (uint)LZCOUNT(uVar7);
            }
            uVar49 = uVar49 + uVar42;
          } while (0x3f < uVar42);
        }
        else {
          uVar42 = (uint)LZCOUNT(uVar7);
LAB_00181eb8:
          uVar49 = uVar42;
          if (0x3f < uVar42) goto LAB_00181ec6;
        }
        uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
        uVar42 = mVar13 + uVar42;
        uVar50 = (uint)(uVar7 >> (bVar12 & 0x3f));
        if (uVar24 < uVar42) {
          uVar42 = uVar42 - uVar24;
          uVar34 = bs->nextL2Line;
          if ((ulong)uVar34 < 0x200) {
            uVar19 = bs->crc16;
            uVar20 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar18 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar17 = (uint)(mVar8 >> 0x10);
              uVar46 = (uint)(mVar8 >> 0x18);
              uVar14 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar14 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar14 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar14 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar46 & 0xff] <<
                              8 ^ uVar18 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar14 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar14 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar14 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar14 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar14 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar46 & 0xff]) >> 8 & 0xff ^ uVar17 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar14 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar14 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar14 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar14 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar14 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar46 & 0xff]) >> 8 & 0xff ^ uVar17 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar14 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar14 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar14 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar46 & 0xff] << 8 ^ uVar18 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar14 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar14 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar14 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar14 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar14 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar46 & 0xff]) >> 8 & 0xff ^ uVar17 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar18) & 0xff]
                ;
                break;
              case 1:
                uVar20 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar20 = (uint)(ushort)((ushort)(uVar20 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar14 ^ uVar20) >> 8 & 0xff]);
              case 3:
                uVar20 = (uint)(ushort)((ushort)(uVar20 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar14 ^ uVar20 >> 8) & 0xff]);
              case 4:
                uVar20 = (uint)(ushort)((ushort)(uVar20 << 8) ^
                                       ma_dr_flac__crc16_table[uVar20 >> 8 ^ uVar46 & 0xff]);
              case 5:
                uVar20 = (uint)(ushort)((ushort)(uVar20 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar20 >> 8 ^ uVar17 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar20 << 8) ^
                         ma_dr_flac__crc16_table[(uVar18 ^ uVar20) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar18 ^ uVar19 >> 8) & 0xff];
                goto LAB_001823f0;
              }
            }
            else {
LAB_001823f0:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar34 + 1;
            uVar7 = bs->cacheL2[uVar34];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            uVar34 = uVar42;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            if (0x40 - (ulong)bs->consumedBits < (ulong)uVar42) {
              return 0;
            }
            uVar7 = bs->cache;
            uVar34 = bs->consumedBits + uVar42;
          }
          uVar50 = uVar50 | (uint)(uVar7 >> (-(byte)uVar42 & 0x3f));
          mVar8 = uVar7 << ((byte)uVar42 & 0x3f);
        }
        else {
          mVar8 = uVar7 << (bVar10 & 0x3f);
          uVar34 = uVar42 + iVar45;
        }
        bs->cache = mVar8;
        bs->consumedBits = uVar34;
        uVar34 = local_108 << (riceParam & 0x1f) | local_e8 & uVar27;
        uVar46 = uVar4 << (riceParam & 0x1f) | local_110 & uVar27;
        uVar20 = uVar25 << (riceParam & 0x1f) | local_a0 & uVar27;
        uVar49 = uVar49 << (riceParam & 0x1f) | uVar50 & uVar27;
        uVar42 = *(uint *)(&DAT_0018fa00 + (ulong)(uVar46 & 1) * 4);
        uVar4 = *(uint *)(&DAT_0018fa00 + (ulong)(uVar20 & 1) * 4);
        uVar25 = *(uint *)(&DAT_0018fa00 + (ulong)(uVar49 & 1) * 4);
        lVar32 = 0;
        iVar30 = lpcOrder - 1;
        switch(iVar30) {
        case 0x1f:
          lVar32 = (long)pSamplesOut[-0x20] * (long)coefficients[0x1f];
        case 0x1e:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1f] * (long)coefficients[0x1e];
        case 0x1d:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1e] * (long)coefficients[0x1d];
        case 0x1c:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1c];
        case 0x1b:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1b];
        case 0x1a:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1a];
        case 0x19:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x19];
        case 0x18:
          lVar32 = lVar32 + (long)pSamplesOut[-0x19] * (long)coefficients[0x18];
        case 0x17:
          lVar32 = lVar32 + (long)pSamplesOut[-0x18] * (long)coefficients[0x17];
        case 0x16:
          lVar32 = lVar32 + (long)pSamplesOut[-0x17] * (long)coefficients[0x16];
        case 0x15:
          lVar32 = lVar32 + (long)pSamplesOut[-0x16] * (long)coefficients[0x15];
        case 0x14:
          lVar32 = lVar32 + (long)pSamplesOut[-0x15] * (long)coefficients[0x14];
        case 0x13:
          lVar32 = lVar32 + (long)pSamplesOut[-0x14] * (long)coefficients[0x13];
        case 0x12:
          lVar32 = lVar32 + (long)pSamplesOut[-0x13] * (long)coefficients[0x12];
        case 0x11:
          lVar32 = lVar32 + (long)pSamplesOut[-0x12] * (long)coefficients[0x11];
        case 0x10:
          lVar32 = lVar32 + (long)pSamplesOut[-0x11] * (long)coefficients[0x10];
        case 0xf:
          lVar32 = lVar32 + (long)pSamplesOut[-0x10] * (long)coefficients[0xf];
        case 0xe:
          lVar32 = lVar32 + (long)pSamplesOut[-0xf] * (long)coefficients[0xe];
        case 0xd:
          lVar32 = lVar32 + (long)pSamplesOut[-0xe] * (long)coefficients[0xd];
        case 0xc:
          lVar32 = lVar32 + (long)pSamplesOut[-0xd] * (long)coefficients[0xc];
        case 0xb:
          lVar32 = lVar32 + (long)pSamplesOut[-0xc] * (long)coefficients[0xb];
        case 10:
          lVar32 = lVar32 + (long)pSamplesOut[-0xb] * (long)coefficients[10];
        case 9:
          lVar32 = lVar32 + (long)pSamplesOut[-10] * (long)coefficients[9];
        case 8:
          lVar32 = lVar32 + (long)pSamplesOut[-9] * (long)coefficients[8];
        case 7:
          lVar32 = lVar32 + (long)pSamplesOut[-8] * (long)coefficients[7];
        case 6:
          lVar32 = lVar32 + (long)pSamplesOut[-7] * (long)coefficients[6];
        case 5:
          lVar32 = lVar32 + (long)pSamplesOut[-6] * (long)coefficients[5];
        case 4:
          lVar32 = lVar32 + (long)pSamplesOut[-5] * (long)coefficients[4];
        case 3:
          lVar32 = lVar32 + (long)pSamplesOut[-4] * (long)coefficients[3];
        case 2:
          lVar32 = lVar32 + (long)pSamplesOut[-3] * (long)coefficients[2];
        case 1:
          lVar32 = lVar32 + (long)pSamplesOut[-2] * (long)coefficients[1];
        case 0:
          lVar32 = lVar32 + (long)pSamplesOut[-1] * (long)*coefficients;
        }
        iVar39 = (uVar34 >> 1 ^ *(uint *)(&DAT_0018fa00 + (ulong)(uVar34 & 1) * 4)) +
                 (int)(lVar32 >> (bVar11 & 0x3f));
        *pSamplesOut = iVar39;
        lVar37 = 0;
        lVar32 = (long)iVar39;
        switch(iVar30) {
        case 0x1f:
          lVar37 = (long)pSamplesOut[-0x1f] * (long)coefficients[0x1f];
        case 0x1e:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1e] * (long)coefficients[0x1e];
        case 0x1d:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1d];
        case 0x1c:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1c];
        case 0x1b:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1b];
        case 0x1a:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x1a];
        case 0x19:
          lVar37 = lVar37 + (long)pSamplesOut[-0x19] * (long)coefficients[0x19];
        case 0x18:
          lVar37 = lVar37 + (long)pSamplesOut[-0x18] * (long)coefficients[0x18];
        case 0x17:
          lVar37 = lVar37 + (long)pSamplesOut[-0x17] * (long)coefficients[0x17];
        case 0x16:
          lVar37 = lVar37 + (long)pSamplesOut[-0x16] * (long)coefficients[0x16];
        case 0x15:
          lVar37 = lVar37 + (long)pSamplesOut[-0x15] * (long)coefficients[0x15];
        case 0x14:
          lVar37 = lVar37 + (long)pSamplesOut[-0x14] * (long)coefficients[0x14];
        case 0x13:
          lVar37 = lVar37 + (long)pSamplesOut[-0x13] * (long)coefficients[0x13];
        case 0x12:
          lVar37 = lVar37 + (long)pSamplesOut[-0x12] * (long)coefficients[0x12];
        case 0x11:
          lVar37 = lVar37 + (long)pSamplesOut[-0x11] * (long)coefficients[0x11];
        case 0x10:
          lVar37 = lVar37 + (long)pSamplesOut[-0x10] * (long)coefficients[0x10];
        case 0xf:
          lVar37 = lVar37 + (long)pSamplesOut[-0xf] * (long)coefficients[0xf];
        case 0xe:
          lVar37 = lVar37 + (long)pSamplesOut[-0xe] * (long)coefficients[0xe];
        case 0xd:
          lVar37 = lVar37 + (long)pSamplesOut[-0xd] * (long)coefficients[0xd];
        case 0xc:
          lVar37 = lVar37 + (long)pSamplesOut[-0xc] * (long)coefficients[0xc];
        case 0xb:
          lVar37 = lVar37 + (long)pSamplesOut[-0xb] * (long)coefficients[0xb];
        case 10:
          lVar37 = lVar37 + (long)pSamplesOut[-10] * (long)coefficients[10];
        case 9:
          lVar37 = lVar37 + (long)pSamplesOut[-9] * (long)coefficients[9];
        case 8:
          lVar37 = lVar37 + (long)pSamplesOut[-8] * (long)coefficients[8];
        case 7:
          lVar37 = lVar37 + (long)pSamplesOut[-7] * (long)coefficients[7];
        case 6:
          lVar37 = lVar37 + (long)pSamplesOut[-6] * (long)coefficients[6];
        case 5:
          lVar37 = lVar37 + (long)pSamplesOut[-5] * (long)coefficients[5];
        case 4:
          lVar37 = lVar37 + (long)pSamplesOut[-4] * (long)coefficients[4];
        case 3:
          lVar37 = lVar37 + (long)pSamplesOut[-3] * (long)coefficients[3];
        case 2:
          lVar37 = lVar37 + (long)pSamplesOut[-2] * (long)coefficients[2];
        case 1:
          lVar37 = lVar37 + (long)pSamplesOut[-1] * (long)coefficients[1];
        case 0:
          lVar37 = lVar37 + *coefficients * lVar32;
        }
        iVar39 = (uVar46 >> 1 ^ uVar42) + (int)(lVar37 >> (bVar11 & 0x3f));
        pSamplesOut[1] = iVar39;
        lVar37 = 0;
        switch(iVar30) {
        case 0x1f:
          lVar37 = (long)pSamplesOut[-0x1e] * (long)coefficients[0x1f];
        case 0x1e:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1e];
        case 0x1d:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1d];
        case 0x1c:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1c];
        case 0x1b:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x1b];
        case 0x1a:
          lVar37 = lVar37 + (long)pSamplesOut[-0x19] * (long)coefficients[0x1a];
        case 0x19:
          lVar37 = lVar37 + (long)pSamplesOut[-0x18] * (long)coefficients[0x19];
        case 0x18:
          lVar37 = lVar37 + (long)pSamplesOut[-0x17] * (long)coefficients[0x18];
        case 0x17:
          lVar37 = lVar37 + (long)pSamplesOut[-0x16] * (long)coefficients[0x17];
        case 0x16:
          lVar37 = lVar37 + (long)pSamplesOut[-0x15] * (long)coefficients[0x16];
        case 0x15:
          lVar37 = lVar37 + (long)pSamplesOut[-0x14] * (long)coefficients[0x15];
        case 0x14:
          lVar37 = lVar37 + (long)pSamplesOut[-0x13] * (long)coefficients[0x14];
        case 0x13:
          lVar37 = lVar37 + (long)pSamplesOut[-0x12] * (long)coefficients[0x13];
        case 0x12:
          lVar37 = lVar37 + (long)pSamplesOut[-0x11] * (long)coefficients[0x12];
        case 0x11:
          lVar37 = lVar37 + (long)pSamplesOut[-0x10] * (long)coefficients[0x11];
        case 0x10:
          lVar37 = lVar37 + (long)pSamplesOut[-0xf] * (long)coefficients[0x10];
        case 0xf:
          lVar37 = lVar37 + (long)pSamplesOut[-0xe] * (long)coefficients[0xf];
        case 0xe:
          lVar37 = lVar37 + (long)pSamplesOut[-0xd] * (long)coefficients[0xe];
        case 0xd:
          lVar37 = lVar37 + (long)pSamplesOut[-0xc] * (long)coefficients[0xd];
        case 0xc:
          lVar37 = lVar37 + (long)pSamplesOut[-0xb] * (long)coefficients[0xc];
        case 0xb:
          lVar37 = lVar37 + (long)pSamplesOut[-10] * (long)coefficients[0xb];
        case 10:
          lVar37 = lVar37 + (long)pSamplesOut[-9] * (long)coefficients[10];
        case 9:
          lVar37 = lVar37 + (long)pSamplesOut[-8] * (long)coefficients[9];
        case 8:
          lVar37 = lVar37 + (long)pSamplesOut[-7] * (long)coefficients[8];
        case 7:
          lVar37 = lVar37 + (long)pSamplesOut[-6] * (long)coefficients[7];
        case 6:
          lVar37 = lVar37 + (long)pSamplesOut[-5] * (long)coefficients[6];
        case 5:
          lVar37 = lVar37 + (long)pSamplesOut[-4] * (long)coefficients[5];
        case 4:
          lVar37 = lVar37 + (long)pSamplesOut[-3] * (long)coefficients[4];
        case 3:
          lVar37 = lVar37 + (long)pSamplesOut[-2] * (long)coefficients[3];
        case 2:
          lVar37 = lVar37 + (long)pSamplesOut[-1] * (long)coefficients[2];
        case 1:
          lVar37 = lVar37 + coefficients[1] * lVar32;
        case 0:
          lVar37 = lVar37 + (long)*coefficients * (long)iVar39;
        }
        iVar41 = (uVar20 >> 1 ^ uVar4) + (int)(lVar37 >> (bVar11 & 0x3f));
        pSamplesOut[2] = iVar41;
        lVar37 = 0;
        switch(iVar30) {
        case 0x1f:
          lVar37 = (long)pSamplesOut[-0x1d] * (long)coefficients[0x1f];
        case 0x1e:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1e];
        case 0x1d:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1d];
        case 0x1c:
          lVar37 = lVar37 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x1c];
        case 0x1b:
          lVar37 = lVar37 + (long)pSamplesOut[-0x19] * (long)coefficients[0x1b];
        case 0x1a:
          lVar37 = lVar37 + (long)pSamplesOut[-0x18] * (long)coefficients[0x1a];
        case 0x19:
          lVar37 = lVar37 + (long)pSamplesOut[-0x17] * (long)coefficients[0x19];
        case 0x18:
          lVar37 = lVar37 + (long)pSamplesOut[-0x16] * (long)coefficients[0x18];
        case 0x17:
          lVar37 = lVar37 + (long)pSamplesOut[-0x15] * (long)coefficients[0x17];
        case 0x16:
          lVar37 = lVar37 + (long)pSamplesOut[-0x14] * (long)coefficients[0x16];
        case 0x15:
          lVar37 = lVar37 + (long)pSamplesOut[-0x13] * (long)coefficients[0x15];
        case 0x14:
          lVar37 = lVar37 + (long)pSamplesOut[-0x12] * (long)coefficients[0x14];
        case 0x13:
          lVar37 = lVar37 + (long)pSamplesOut[-0x11] * (long)coefficients[0x13];
        case 0x12:
          lVar37 = lVar37 + (long)pSamplesOut[-0x10] * (long)coefficients[0x12];
        case 0x11:
          lVar37 = lVar37 + (long)pSamplesOut[-0xf] * (long)coefficients[0x11];
        case 0x10:
          lVar37 = lVar37 + (long)pSamplesOut[-0xe] * (long)coefficients[0x10];
        case 0xf:
          lVar37 = lVar37 + (long)pSamplesOut[-0xd] * (long)coefficients[0xf];
        case 0xe:
          lVar37 = lVar37 + (long)pSamplesOut[-0xc] * (long)coefficients[0xe];
        case 0xd:
          lVar37 = lVar37 + (long)pSamplesOut[-0xb] * (long)coefficients[0xd];
        case 0xc:
          lVar37 = lVar37 + (long)pSamplesOut[-10] * (long)coefficients[0xc];
        case 0xb:
          lVar37 = lVar37 + (long)pSamplesOut[-9] * (long)coefficients[0xb];
        case 10:
          lVar37 = lVar37 + (long)pSamplesOut[-8] * (long)coefficients[10];
        case 9:
          lVar37 = lVar37 + (long)pSamplesOut[-7] * (long)coefficients[9];
        case 8:
          lVar37 = lVar37 + (long)pSamplesOut[-6] * (long)coefficients[8];
        case 7:
          lVar37 = lVar37 + (long)pSamplesOut[-5] * (long)coefficients[7];
        case 6:
          lVar37 = lVar37 + (long)pSamplesOut[-4] * (long)coefficients[6];
        case 5:
          lVar37 = lVar37 + (long)pSamplesOut[-3] * (long)coefficients[5];
        case 4:
          lVar37 = lVar37 + (long)pSamplesOut[-2] * (long)coefficients[4];
        case 3:
          lVar37 = lVar37 + (long)pSamplesOut[-1] * (long)coefficients[3];
        case 2:
          lVar37 = lVar37 + lVar32 * coefficients[2];
        case 1:
          lVar37 = lVar37 + (long)iVar39 * (long)coefficients[1];
        case 0:
          lVar37 = lVar37 + (long)iVar41 * (long)*coefficients;
        default:
          pSamplesOut[3] = (uVar49 >> 1 ^ uVar25) + (int)(lVar37 >> (bVar11 & 0x3f));
          pSamplesOut = pSamplesOut + 4;
        }
      }
    }
    for (; (uint)uVar9 < count; uVar9 = (ulong)((uint)uVar9 + 1)) {
      uVar7 = bs->cache;
      mVar13 = bs->consumedBits;
      if (ma_dr_flac__gIsLZCNTSupported == 0) {
        if (uVar7 != 0) {
          if (uVar7 < 0x1000000000000000) {
            bVar52 = uVar7 >> 0x20 == 0;
            uVar23 = uVar7 << 0x20;
            if (!bVar52) {
              uVar23 = uVar7;
            }
            iVar39 = (uint)bVar52 * 0x20;
            iVar30 = iVar39 + 0x10;
            uVar3 = uVar23 << 0x10;
            if (0xffffffffffff < uVar23) {
              iVar30 = iVar39;
              uVar3 = uVar23;
            }
            iVar39 = iVar30 + 8;
            uVar23 = uVar3 << 8;
            if (0xffffffffffffff < uVar3) {
              iVar39 = iVar30;
              uVar23 = uVar3;
            }
            iVar30 = iVar39 + 4;
            uVar3 = uVar23 << 4;
            if (0xfffffffffffffff < uVar23) {
              iVar30 = iVar39;
              uVar3 = uVar23;
            }
            iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar3 >> 0x3c) * 4);
          }
          else {
            iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                             (uVar7 >> 0x3c) * 4);
          }
          uVar42 = iVar30 - 1;
          goto LAB_0018348d;
        }
LAB_0018349b:
        uVar4 = 0x40 - mVar13;
        do {
          uVar42 = bs->nextL2Line;
          if ((ulong)uVar42 < 0x200) {
            uVar19 = bs->crc16;
            uVar25 = (uint)uVar19;
            if (bs->crc16CacheIgnoredBytes < 8) {
              mVar8 = bs->crc16Cache;
              uVar20 = (uint)mVar8;
              uVar2 = (ushort)(mVar8 >> 0x30);
              uVar50 = (uint)(mVar8 >> 0x10);
              uVar49 = (uint)(mVar8 >> 0x18);
              uVar34 = (uint)(mVar8 >> 0x20);
              switch(bs->crc16CacheIgnoredBytes) {
              case 0:
                bs->crc16 = ma_dr_flac__crc16_table
                            [((uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar34 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar19 >> 8) ^
                                                     (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar2 ^
                                                    ((uint)uVar19 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar19 >> 8) ^
                                                           (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar2 ^
                                                              ((uint)uVar19 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar34 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar49 & 0xff] <<
                              8 ^ uVar20 ^
                             (uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar34 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar34 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) & 0xff])
                             >> 8 & 0xff] << 8 ^
                            ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(((uint)ma_dr_flac__crc16_table
                                              [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar2 ^
                                                                 ((uint)uVar19 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar34 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar19 >> 8) ^
                                                                        (uint)(byte)(mVar8 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                               0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [((uint)ma_dr_flac__crc16_table
                                                     [(uVar34 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar19 >> 8) ^
                                                              (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                            [(uVar34 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                              uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) & 0xff]
                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar34 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar19 >> 8) ^
                                                                     (uint)(byte)(mVar8 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar49 & 0xff] << 8 ^ uVar20 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar34 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar34 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar34 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar34 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar49 & 0xff]) >> 8 & 0xff ^ uVar50 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar20) & 0xff]
                ;
                break;
              case 1:
                uVar25 = (uint)(ushort)(uVar19 << 8 ^
                                       ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]
                                       );
              case 2:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar34 ^ uVar25) >> 8 & 0xff]);
              case 3:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[(uVar34 ^ uVar25 >> 8) & 0xff]);
              case 4:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table[uVar25 >> 8 ^ uVar49 & 0xff]);
              case 5:
                uVar25 = (uint)(ushort)((ushort)(uVar25 << 8) ^
                                       ma_dr_flac__crc16_table
                                       [(uVar25 >> 8 ^ uVar50 & 0xffff) & 0xff]);
              case 6:
                uVar19 = (ushort)(uVar25 << 8) ^
                         ma_dr_flac__crc16_table[(uVar20 ^ uVar25) >> 8 & 0xff];
              case 7:
                uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar20 ^ uVar19 >> 8) & 0xff];
                goto LAB_00183679;
              }
            }
            else {
LAB_00183679:
              bs->crc16 = uVar19;
              bs->crc16CacheIgnoredBytes = 0;
            }
            bs->nextL2Line = uVar42 + 1;
            uVar7 = bs->cacheL2[uVar42];
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
            bs->crc16Cache = uVar7;
            mVar13 = 0;
          }
          else {
            mVar5 = ma_dr_flac__reload_cache(bs);
            if (mVar5 == 0) {
              return 0;
            }
            uVar7 = bs->cache;
            mVar13 = bs->consumedBits;
          }
          if (ma_dr_flac__gIsLZCNTSupported == 0) {
            uVar42 = 0x40;
            if (uVar7 != 0) {
              if (uVar7 < 0x1000000000000000) {
                bVar52 = uVar7 >> 0x20 == 0;
                uVar23 = uVar7 << 0x20;
                if (!bVar52) {
                  uVar23 = uVar7;
                }
                iVar39 = (uint)bVar52 * 0x20;
                iVar30 = iVar39 + 0x10;
                uVar3 = uVar23 << 0x10;
                if (0xffffffffffff < uVar23) {
                  iVar30 = iVar39;
                  uVar3 = uVar23;
                }
                iVar39 = iVar30 + 8;
                uVar23 = uVar3 << 8;
                if (0xffffffffffffff < uVar3) {
                  iVar39 = iVar30;
                  uVar23 = uVar3;
                }
                iVar30 = iVar39 + 4;
                uVar3 = uVar23 << 4;
                if (0xfffffffffffffff < uVar23) {
                  iVar30 = iVar39;
                  uVar3 = uVar23;
                }
                iVar30 = iVar30 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4
                                          + (uVar3 >> 0x3c) * 4);
              }
              else {
                iVar30 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                 (uVar7 >> 0x3c) * 4);
              }
              uVar42 = iVar30 - 1;
            }
          }
          else {
            uVar42 = (uint)LZCOUNT(uVar7);
          }
          uVar4 = uVar4 + uVar42;
        } while (0x3f < uVar42);
      }
      else {
        uVar42 = (uint)LZCOUNT(uVar7);
LAB_0018348d:
        uVar4 = uVar42;
        if (0x3f < uVar42) goto LAB_0018349b;
      }
      uVar7 = uVar7 << ((byte)uVar42 & 0x3f);
      uVar42 = mVar13 + uVar42;
      uVar25 = (uint)(uVar7 >> (bVar12 & 0x3f));
      if (uVar24 < uVar42) {
        uVar42 = uVar42 - uVar24;
        uVar49 = bs->nextL2Line;
        if ((ulong)uVar49 < 0x200) {
          uVar19 = bs->crc16;
          uVar50 = (uint)uVar19;
          if (bs->crc16CacheIgnoredBytes < 8) {
            mVar8 = bs->crc16Cache;
            uVar17 = (uint)mVar8;
            uVar2 = (ushort)(mVar8 >> 0x30);
            uVar20 = (uint)(mVar8 >> 0x10);
            uVar34 = (uint)(mVar8 >> 0x18);
            uVar46 = (uint)(mVar8 >> 0x20);
            switch(bs->crc16CacheIgnoredBytes) {
            case 0:
              bs->crc16 = ma_dr_flac__crc16_table
                          [((uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [(uVar46 >> 8 ^
                                           ((uint)ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)uVar2 ^
                                                  ((uint)uVar19 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar19 >> 8) ^
                                                         (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                           [((uint)uVar2 ^
                                                            ((uint)uVar19 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar19 >> 8) ^
                                                                   (uint)(byte)(mVar8 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uVar46 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar19 >> 8) ^
                                                                   (uint)(byte)(mVar8 >> 0x38)] << 8
                                                           ^ (uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar19 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar19 >> 8) ^
                                                                           (uint)(byte)(mVar8 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                                  ) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                   uVar34 & 0xff] << 8 ^ uVar17 ^
                           (uint)ma_dr_flac__crc16_table
                                 [(((uint)ma_dr_flac__crc16_table
                                          [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar2 ^
                                                             ((uint)uVar19 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar46 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar19 >> 8) ^
                                                                    (uint)(byte)(mVar8 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [((uint)ma_dr_flac__crc16_table
                                                 [(uVar46 >> 8 ^
                                                  ((uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar2 ^
                                                         ((uint)uVar19 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar19 >> 8) ^
                                                                (uint)(byte)(mVar8 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                          (uint)ma_dr_flac__crc16_table
                                                [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar2 ^
                                                                   ((uint)uVar19 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff] << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uVar46 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar19 >> 8) ^
                                                                          (uint)(byte)(mVar8 >> 0x38
                                                                                      )] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar19 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar34 & 0xff])
                                   >> 8 & 0xff ^ uVar20 & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                          ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar2 ^
                                                               ((uint)uVar19 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar46 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar19 >> 8) ^
                                                                      (uint)(byte)(mVar8 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [((uint)ma_dr_flac__crc16_table
                                                   [(uVar46 >> 8 ^
                                                    ((uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar19 >> 8) ^
                                                            (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [((uint)uVar2 ^
                                                           ((uint)uVar19 << 8 ^
                                                           (uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar19 >> 8) ^
                                                                  (uint)(byte)(mVar8 >> 0x38)]) >> 8
                                                           & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] <<
                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                       [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar19 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                            uVar34 & 0xff]) >> 8 & 0xff ^ uVar20 & 0xffff) & 0xff]
                             << 8 ^ (uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [((uint)ma_dr_flac__crc16_table
                                                          [(uVar46 >> 8 ^
                                                           ((uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar19 >> 8) ^
                                                                   (uint)(byte)(mVar8 >> 0x38)] << 8
                                                           ^ (uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar19 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar19 >> 8) ^
                                                                           (uint)(byte)(mVar8 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                                  << 8 ^ (uint)ma_dr_flac__crc16_table
                                                               [(uVar46 ^ ((uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar2 ^
                                                   ((uint)uVar19 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar19 >> 8) ^
                                                          (uint)(byte)(mVar8 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar34 & 0xff] << 8 ^ uVar17 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [(((uint)ma_dr_flac__crc16_table
                                                          [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar46 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar19 >> 8) ^
                                                                         (uint)(byte)(mVar8 >> 0x38)
                                                                        ] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar19 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                                  ^ (uint)ma_dr_flac__crc16_table
                                                          [(uVar46 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar19 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar19 >> 8) ^ (uint)(byte)(mVar8 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar46 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar19 >> 8) ^
                                                                 (uint)(byte)(mVar8 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar2 ^
                                                                ((uint)uVar19 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar19 >> 8) ^
                                                                       (uint)(byte)(mVar8 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar34 & 0xff]) >> 8 & 0xff ^ uVar20 & 0xffff) &
                                                  0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar17) & 0xff]
              ;
              break;
            case 1:
              uVar50 = (uint)(ushort)(uVar19 << 8 ^
                                     ma_dr_flac__crc16_table[(ushort)(uVar2 ^ uVar19 >> 8) & 0xff]);
            case 2:
              uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                     ma_dr_flac__crc16_table[(uVar46 ^ uVar50) >> 8 & 0xff]);
            case 3:
              uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                     ma_dr_flac__crc16_table[(uVar46 ^ uVar50 >> 8) & 0xff]);
            case 4:
              uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                     ma_dr_flac__crc16_table[uVar50 >> 8 ^ uVar34 & 0xff]);
            case 5:
              uVar50 = (uint)(ushort)((ushort)(uVar50 << 8) ^
                                     ma_dr_flac__crc16_table[(uVar50 >> 8 ^ uVar20 & 0xffff) & 0xff]
                                     );
            case 6:
              uVar19 = (ushort)(uVar50 << 8) ^
                       ma_dr_flac__crc16_table[(uVar17 ^ uVar50) >> 8 & 0xff];
            case 7:
              uVar19 = uVar19 << 8 ^ ma_dr_flac__crc16_table[(uVar17 ^ (byte)(uVar19 >> 8)) & 0xff];
              goto LAB_0018398f;
            }
          }
          else {
LAB_0018398f:
            bs->crc16 = uVar19;
            bs->crc16CacheIgnoredBytes = 0;
          }
          bs->nextL2Line = uVar49 + 1;
          uVar7 = bs->cacheL2[uVar49];
          uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38;
          bs->crc16Cache = uVar7;
          uVar49 = uVar42;
        }
        else {
          mVar5 = ma_dr_flac__reload_cache(bs);
          if (mVar5 == 0) {
            return 0;
          }
          if (0x40 - (ulong)bs->consumedBits < (ulong)uVar42) {
            return 0;
          }
          uVar7 = bs->cache;
          uVar49 = bs->consumedBits + uVar42;
        }
        uVar25 = uVar25 | (uint)(uVar7 >> (-(byte)uVar42 & 0x3f));
        mVar8 = uVar7 << ((byte)uVar42 & 0x3f);
      }
      else {
        mVar8 = uVar7 << (bVar10 & 0x3f);
        uVar49 = uVar42 + iVar45;
      }
      bs->cache = mVar8;
      bs->consumedBits = uVar49;
      uVar4 = uVar4 << (riceParam & 0x1f) | uVar25 & uVar27;
      uVar42 = lpcPrecision + bitsPerSample;
      for (uVar7 = (ulong)lpcOrder; (int)uVar7 != 0; uVar7 = uVar7 >> 1) {
        uVar42 = uVar42 + 1;
      }
      lVar32 = 0;
      iVar30 = 0;
      if (uVar42 < 0x21) {
        switch(lpcOrder) {
        case 0x20:
          iVar30 = pSamplesOut[-0x20] * coefficients[0x1f];
        case 0x1f:
          iVar30 = iVar30 + pSamplesOut[-0x1f] * coefficients[0x1e];
        case 0x1e:
          iVar30 = iVar30 + pSamplesOut[-0x1e] * coefficients[0x1d];
        case 0x1d:
          iVar30 = iVar30 + pSamplesOut[-0x1d] * coefficients[0x1c];
        case 0x1c:
          iVar30 = iVar30 + pSamplesOut[-0x1c] * coefficients[0x1b];
        case 0x1b:
          iVar30 = iVar30 + pSamplesOut[-0x1b] * coefficients[0x1a];
        case 0x1a:
          iVar30 = iVar30 + pSamplesOut[-0x1a] * coefficients[0x19];
        case 0x19:
          iVar30 = iVar30 + pSamplesOut[-0x19] * coefficients[0x18];
        case 0x18:
          iVar30 = iVar30 + pSamplesOut[-0x18] * coefficients[0x17];
        case 0x17:
          iVar30 = iVar30 + pSamplesOut[-0x17] * coefficients[0x16];
        case 0x16:
          iVar30 = iVar30 + pSamplesOut[-0x16] * coefficients[0x15];
        case 0x15:
          iVar30 = iVar30 + pSamplesOut[-0x15] * coefficients[0x14];
        case 0x14:
          iVar30 = iVar30 + pSamplesOut[-0x14] * coefficients[0x13];
        case 0x13:
          iVar30 = iVar30 + pSamplesOut[-0x13] * coefficients[0x12];
        case 0x12:
          iVar30 = iVar30 + pSamplesOut[-0x12] * coefficients[0x11];
        case 0x11:
          iVar30 = iVar30 + pSamplesOut[-0x11] * coefficients[0x10];
        case 0x10:
          iVar30 = iVar30 + pSamplesOut[-0x10] * coefficients[0xf];
        case 0xf:
          iVar30 = iVar30 + pSamplesOut[-0xf] * coefficients[0xe];
        case 0xe:
          iVar30 = iVar30 + pSamplesOut[-0xe] * coefficients[0xd];
        case 0xd:
          iVar30 = iVar30 + pSamplesOut[-0xd] * coefficients[0xc];
        case 0xc:
          iVar30 = iVar30 + pSamplesOut[-0xc] * coefficients[0xb];
        case 0xb:
          iVar30 = iVar30 + pSamplesOut[-0xb] * coefficients[10];
        case 10:
          iVar30 = iVar30 + pSamplesOut[-10] * coefficients[9];
        case 9:
          iVar30 = iVar30 + pSamplesOut[-9] * coefficients[8];
        case 8:
          iVar30 = iVar30 + pSamplesOut[-8] * coefficients[7];
        case 7:
          iVar30 = iVar30 + pSamplesOut[-7] * coefficients[6];
        case 6:
          iVar30 = iVar30 + pSamplesOut[-6] * coefficients[5];
        case 5:
          iVar30 = iVar30 + pSamplesOut[-5] * coefficients[4];
        case 4:
          iVar30 = iVar30 + pSamplesOut[-4] * coefficients[3];
        case 3:
          iVar30 = iVar30 + pSamplesOut[-3] * coefficients[2];
        case 2:
          iVar30 = iVar30 + pSamplesOut[-2] * coefficients[1];
        case 1:
          iVar30 = iVar30 + pSamplesOut[-1] * *coefficients;
        default:
          iVar30 = iVar30 >> (bVar11 & 0x1f);
        }
      }
      else {
        switch(lpcOrder) {
        case 0x20:
          lVar32 = (long)pSamplesOut[-0x20] * (long)coefficients[0x1f];
        case 0x1f:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1f] * (long)coefficients[0x1e];
        case 0x1e:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1e] * (long)coefficients[0x1d];
        case 0x1d:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1d] * (long)coefficients[0x1c];
        case 0x1c:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1c] * (long)coefficients[0x1b];
        case 0x1b:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1b] * (long)coefficients[0x1a];
        case 0x1a:
          lVar32 = lVar32 + (long)pSamplesOut[-0x1a] * (long)coefficients[0x19];
        case 0x19:
          lVar32 = lVar32 + (long)pSamplesOut[-0x19] * (long)coefficients[0x18];
        case 0x18:
          lVar32 = lVar32 + (long)pSamplesOut[-0x18] * (long)coefficients[0x17];
        case 0x17:
          lVar32 = lVar32 + (long)pSamplesOut[-0x17] * (long)coefficients[0x16];
        case 0x16:
          lVar32 = lVar32 + (long)pSamplesOut[-0x16] * (long)coefficients[0x15];
        case 0x15:
          lVar32 = lVar32 + (long)pSamplesOut[-0x15] * (long)coefficients[0x14];
        case 0x14:
          lVar32 = lVar32 + (long)pSamplesOut[-0x14] * (long)coefficients[0x13];
        case 0x13:
          lVar32 = lVar32 + (long)pSamplesOut[-0x13] * (long)coefficients[0x12];
        case 0x12:
          lVar32 = lVar32 + (long)pSamplesOut[-0x12] * (long)coefficients[0x11];
        case 0x11:
          lVar32 = lVar32 + (long)pSamplesOut[-0x11] * (long)coefficients[0x10];
        case 0x10:
          lVar32 = lVar32 + (long)pSamplesOut[-0x10] * (long)coefficients[0xf];
        case 0xf:
          lVar32 = lVar32 + (long)pSamplesOut[-0xf] * (long)coefficients[0xe];
        case 0xe:
          lVar32 = lVar32 + (long)pSamplesOut[-0xe] * (long)coefficients[0xd];
        case 0xd:
          lVar32 = lVar32 + (long)pSamplesOut[-0xd] * (long)coefficients[0xc];
        case 0xc:
          lVar32 = lVar32 + (long)pSamplesOut[-0xc] * (long)coefficients[0xb];
        case 0xb:
          lVar32 = lVar32 + (long)pSamplesOut[-0xb] * (long)coefficients[10];
        case 10:
          lVar32 = lVar32 + (long)pSamplesOut[-10] * (long)coefficients[9];
        case 9:
          lVar32 = lVar32 + (long)pSamplesOut[-9] * (long)coefficients[8];
        case 8:
          lVar32 = lVar32 + (long)pSamplesOut[-8] * (long)coefficients[7];
        case 7:
          lVar32 = lVar32 + (long)pSamplesOut[-7] * (long)coefficients[6];
        case 6:
          lVar32 = lVar32 + (long)pSamplesOut[-6] * (long)coefficients[5];
        case 5:
          lVar32 = lVar32 + (long)pSamplesOut[-5] * (long)coefficients[4];
        case 4:
          lVar32 = lVar32 + (long)pSamplesOut[-4] * (long)coefficients[3];
        case 3:
          lVar32 = lVar32 + (long)pSamplesOut[-3] * (long)coefficients[2];
        case 2:
          lVar32 = lVar32 + (long)pSamplesOut[-2] * (long)coefficients[1];
        case 1:
          lVar32 = lVar32 + (long)pSamplesOut[-1] * (long)*coefficients;
        default:
          iVar30 = (int)(lVar32 >> (bVar11 & 0x3f));
        }
      }
      *pSamplesOut = (*(uint *)(&DAT_0018fa00 + (ulong)(uVar4 & 1) * 4) ^ uVar4 >> 1) + iVar30;
      pSamplesOut = pSamplesOut + 1;
    }
  }
  return 1;
}

Assistant:

static ma_bool32 ma_dr_flac__decode_samples_with_residual__rice__scalar(ma_dr_flac_bs* bs, ma_uint32 bitsPerSample, ma_uint32 count, ma_uint8 riceParam, ma_uint32 lpcOrder, ma_int32 lpcShift, ma_uint32 lpcPrecision, const ma_int32* coefficients, ma_int32* pSamplesOut)
{
    ma_uint32 t[2] = {0x00000000, 0xFFFFFFFF};
    ma_uint32 zeroCountPart0 = 0;
    ma_uint32 zeroCountPart1 = 0;
    ma_uint32 zeroCountPart2 = 0;
    ma_uint32 zeroCountPart3 = 0;
    ma_uint32 riceParamPart0 = 0;
    ma_uint32 riceParamPart1 = 0;
    ma_uint32 riceParamPart2 = 0;
    ma_uint32 riceParamPart3 = 0;
    ma_uint32 riceParamMask;
    const ma_int32* pSamplesOutEnd;
    ma_uint32 i;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pSamplesOut != NULL);
    if (lpcOrder == 0) {
        return ma_dr_flac__decode_samples_with_residual__rice__scalar_zeroorder(bs, bitsPerSample, count, riceParam, lpcOrder, lpcShift, coefficients, pSamplesOut);
    }
    riceParamMask  = (ma_uint32)~((~0UL) << riceParam);
    pSamplesOutEnd = pSamplesOut + (count & ~3);
    if (ma_dr_flac__use_64_bit_prediction(bitsPerSample, lpcOrder, lpcPrecision)) {
        while (pSamplesOut < pSamplesOutEnd) {
            if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart1, &riceParamPart1) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart2, &riceParamPart2) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart3, &riceParamPart3)) {
                return MA_FALSE;
            }
            riceParamPart0 &= riceParamMask;
            riceParamPart1 &= riceParamMask;
            riceParamPart2 &= riceParamMask;
            riceParamPart3 &= riceParamMask;
            riceParamPart0 |= (zeroCountPart0 << riceParam);
            riceParamPart1 |= (zeroCountPart1 << riceParam);
            riceParamPart2 |= (zeroCountPart2 << riceParam);
            riceParamPart3 |= (zeroCountPart3 << riceParam);
            riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
            riceParamPart1  = (riceParamPart1 >> 1) ^ t[riceParamPart1 & 0x01];
            riceParamPart2  = (riceParamPart2 >> 1) ^ t[riceParamPart2 & 0x01];
            riceParamPart3  = (riceParamPart3 >> 1) ^ t[riceParamPart3 & 0x01];
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
            pSamplesOut[1] = riceParamPart1 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 1);
            pSamplesOut[2] = riceParamPart2 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 2);
            pSamplesOut[3] = riceParamPart3 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 3);
            pSamplesOut += 4;
        }
    } else {
        while (pSamplesOut < pSamplesOutEnd) {
            if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart1, &riceParamPart1) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart2, &riceParamPart2) ||
                !ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart3, &riceParamPart3)) {
                return MA_FALSE;
            }
            riceParamPart0 &= riceParamMask;
            riceParamPart1 &= riceParamMask;
            riceParamPart2 &= riceParamMask;
            riceParamPart3 &= riceParamMask;
            riceParamPart0 |= (zeroCountPart0 << riceParam);
            riceParamPart1 |= (zeroCountPart1 << riceParam);
            riceParamPart2 |= (zeroCountPart2 << riceParam);
            riceParamPart3 |= (zeroCountPart3 << riceParam);
            riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
            riceParamPart1  = (riceParamPart1 >> 1) ^ t[riceParamPart1 & 0x01];
            riceParamPart2  = (riceParamPart2 >> 1) ^ t[riceParamPart2 & 0x01];
            riceParamPart3  = (riceParamPart3 >> 1) ^ t[riceParamPart3 & 0x01];
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
            pSamplesOut[1] = riceParamPart1 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 1);
            pSamplesOut[2] = riceParamPart2 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 2);
            pSamplesOut[3] = riceParamPart3 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 3);
            pSamplesOut += 4;
        }
    }
    i = (count & ~3);
    while (i < count) {
        if (!ma_dr_flac__read_rice_parts_x1(bs, riceParam, &zeroCountPart0, &riceParamPart0)) {
            return MA_FALSE;
        }
        riceParamPart0 &= riceParamMask;
        riceParamPart0 |= (zeroCountPart0 << riceParam);
        riceParamPart0  = (riceParamPart0 >> 1) ^ t[riceParamPart0 & 0x01];
        if (ma_dr_flac__use_64_bit_prediction(bitsPerSample, lpcOrder, lpcPrecision)) {
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_64(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
        } else {
            pSamplesOut[0] = riceParamPart0 + ma_dr_flac__calculate_prediction_32(lpcOrder, lpcShift, coefficients, pSamplesOut + 0);
        }
        i += 1;
        pSamplesOut += 1;
    }
    return MA_TRUE;
}